

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  bool bVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  bool bVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar65;
  ulong uVar66;
  byte bVar67;
  long lVar68;
  uint uVar69;
  ulong uVar70;
  undefined4 uVar71;
  byte unaff_R14B;
  float fVar72;
  undefined8 uVar73;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 extraout_var [60];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar136;
  float fVar137;
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  vint4 ai;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar187 [16];
  undefined1 auVar191 [32];
  vint4 bi;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [28];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [28];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  float fVar224;
  vint4 ai_1;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar225;
  float fVar226;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  float fVar232;
  float fVar235;
  float fVar236;
  undefined1 auVar233 [16];
  float fVar237;
  undefined1 auVar234 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar250;
  float fVar251;
  undefined1 auVar243 [16];
  float fVar252;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar244 [16];
  undefined1 auVar248 [32];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [64];
  float fVar258;
  float fVar259;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined4 uVar264;
  undefined4 uVar265;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_af1;
  int local_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  ulong local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined8 local_920;
  undefined4 local_918;
  float local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  uint local_904;
  uint local_900;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  ulong local_5c0;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var_00 [60];
  
  PVar3 = prim[1];
  uVar70 = (ulong)(byte)PVar3;
  fVar104 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar83 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  auVar192._0_4_ = fVar104 * (ray->dir).field_0.m128[0];
  auVar192._4_4_ = fVar104 * (ray->dir).field_0.m128[1];
  auVar192._8_4_ = fVar104 * (ray->dir).field_0.m128[2];
  auVar192._12_4_ = fVar104 * (ray->dir).field_0.m128[3];
  auVar74._0_4_ = fVar104 * auVar83._0_4_;
  auVar74._4_4_ = fVar104 * auVar83._4_4_;
  auVar74._8_4_ = fVar104 * auVar83._8_4_;
  auVar74._12_4_ = fVar104 * auVar83._12_4_;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xb + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar70 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  uVar66 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar70 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar66 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar266._4_4_ = auVar192._0_4_;
  auVar266._0_4_ = auVar192._0_4_;
  auVar266._8_4_ = auVar192._0_4_;
  auVar266._12_4_ = auVar192._0_4_;
  auVar106 = vshufps_avx(auVar192,auVar192,0x55);
  auVar75 = vshufps_avx(auVar192,auVar192,0xaa);
  fVar104 = auVar75._0_4_;
  auVar243._0_4_ = fVar104 * auVar234._0_4_;
  fVar72 = auVar75._4_4_;
  auVar243._4_4_ = fVar72 * auVar234._4_4_;
  fVar136 = auVar75._8_4_;
  auVar243._8_4_ = fVar136 * auVar234._8_4_;
  fVar224 = auVar75._12_4_;
  auVar243._12_4_ = fVar224 * auVar234._12_4_;
  auVar233._0_4_ = auVar144._0_4_ * fVar104;
  auVar233._4_4_ = auVar144._4_4_ * fVar72;
  auVar233._8_4_ = auVar144._8_4_ * fVar136;
  auVar233._12_4_ = auVar144._12_4_ * fVar224;
  auVar217._0_4_ = auVar142._0_4_ * fVar104;
  auVar217._4_4_ = auVar142._4_4_ * fVar72;
  auVar217._8_4_ = auVar142._8_4_ * fVar136;
  auVar217._12_4_ = auVar142._12_4_ * fVar224;
  auVar75 = vfmadd231ps_fma(auVar243,auVar106,auVar184);
  auVar107 = vfmadd231ps_fma(auVar233,auVar106,auVar123);
  auVar106 = vfmadd231ps_fma(auVar217,auVar76,auVar106);
  auVar159 = vfmadd231ps_fma(auVar75,auVar266,auVar83);
  auVar107 = vfmadd231ps_fma(auVar107,auVar266,auVar114);
  auVar182 = vfmadd231ps_fma(auVar106,auVar77,auVar266);
  auVar267._4_4_ = auVar74._0_4_;
  auVar267._0_4_ = auVar74._0_4_;
  auVar267._8_4_ = auVar74._0_4_;
  auVar267._12_4_ = auVar74._0_4_;
  auVar106 = vshufps_avx(auVar74,auVar74,0x55);
  auVar75 = vshufps_avx(auVar74,auVar74,0xaa);
  fVar104 = auVar75._0_4_;
  auVar193._0_4_ = fVar104 * auVar234._0_4_;
  fVar72 = auVar75._4_4_;
  auVar193._4_4_ = fVar72 * auVar234._4_4_;
  fVar136 = auVar75._8_4_;
  auVar193._8_4_ = fVar136 * auVar234._8_4_;
  fVar224 = auVar75._12_4_;
  auVar193._12_4_ = fVar224 * auVar234._12_4_;
  auVar105._0_4_ = auVar144._0_4_ * fVar104;
  auVar105._4_4_ = auVar144._4_4_ * fVar72;
  auVar105._8_4_ = auVar144._8_4_ * fVar136;
  auVar105._12_4_ = auVar144._12_4_ * fVar224;
  auVar75._0_4_ = auVar142._0_4_ * fVar104;
  auVar75._4_4_ = auVar142._4_4_ * fVar72;
  auVar75._8_4_ = auVar142._8_4_ * fVar136;
  auVar75._12_4_ = auVar142._12_4_ * fVar224;
  auVar184 = vfmadd231ps_fma(auVar193,auVar106,auVar184);
  auVar234 = vfmadd231ps_fma(auVar105,auVar106,auVar123);
  auVar123 = vfmadd231ps_fma(auVar75,auVar106,auVar76);
  auVar144 = vfmadd231ps_fma(auVar184,auVar267,auVar83);
  auVar76 = vfmadd231ps_fma(auVar234,auVar267,auVar114);
  auVar142 = vfmadd231ps_fma(auVar123,auVar267,auVar77);
  local_a40._8_4_ = 0x7fffffff;
  local_a40._0_8_ = 0x7fffffff7fffffff;
  local_a40._12_4_ = 0x7fffffff;
  auVar83 = vandps_avx(auVar159,local_a40);
  auVar181._8_4_ = 0x219392ef;
  auVar181._0_8_ = 0x219392ef219392ef;
  auVar181._12_4_ = 0x219392ef;
  auVar83 = vcmpps_avx(auVar83,auVar181,1);
  auVar184 = vblendvps_avx(auVar159,auVar181,auVar83);
  auVar83 = vandps_avx(auVar107,local_a40);
  auVar83 = vcmpps_avx(auVar83,auVar181,1);
  auVar234 = vblendvps_avx(auVar107,auVar181,auVar83);
  auVar83 = vandps_avx(auVar182,local_a40);
  auVar83 = vcmpps_avx(auVar83,auVar181,1);
  auVar83 = vblendvps_avx(auVar182,auVar181,auVar83);
  auVar114 = vrcpps_avx(auVar184);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = &DAT_3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar184 = vfnmadd213ps_fma(auVar184,auVar114,auVar214);
  auVar114 = vfmadd132ps_fma(auVar184,auVar114,auVar114);
  auVar184 = vrcpps_avx(auVar234);
  auVar234 = vfnmadd213ps_fma(auVar234,auVar184,auVar214);
  auVar123 = vfmadd132ps_fma(auVar234,auVar184,auVar184);
  auVar184 = vrcpps_avx(auVar83);
  auVar234 = vfnmadd213ps_fma(auVar83,auVar184,auVar214);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar77 = vfmadd132ps_fma(auVar234,auVar184,auVar184);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar144);
  auVar182._0_4_ = auVar114._0_4_ * auVar83._0_4_;
  auVar182._4_4_ = auVar114._4_4_ * auVar83._4_4_;
  auVar182._8_4_ = auVar114._8_4_ * auVar83._8_4_;
  auVar182._12_4_ = auVar114._12_4_ * auVar83._12_4_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar83 = vpmovsxwd_avx(auVar184);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar144);
  auVar194._0_4_ = auVar114._0_4_ * auVar83._0_4_;
  auVar194._4_4_ = auVar114._4_4_ * auVar83._4_4_;
  auVar194._8_4_ = auVar114._8_4_ * auVar83._8_4_;
  auVar194._12_4_ = auVar114._12_4_ * auVar83._12_4_;
  auVar107._1_3_ = 0;
  auVar107[0] = PVar3;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar184 = vpmovsxwd_avx(auVar234);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar70 * -2 + 6);
  auVar83 = vpmovsxwd_avx(auVar114);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar76);
  auVar218._0_4_ = auVar83._0_4_ * auVar123._0_4_;
  auVar218._4_4_ = auVar83._4_4_ * auVar123._4_4_;
  auVar218._8_4_ = auVar83._8_4_ * auVar123._8_4_;
  auVar218._12_4_ = auVar83._12_4_ * auVar123._12_4_;
  auVar83 = vcvtdq2ps_avx(auVar184);
  auVar83 = vsubps_avx(auVar83,auVar76);
  auVar106._0_4_ = auVar123._0_4_ * auVar83._0_4_;
  auVar106._4_4_ = auVar123._4_4_ * auVar83._4_4_;
  auVar106._8_4_ = auVar123._8_4_ * auVar83._8_4_;
  auVar106._12_4_ = auVar123._12_4_ * auVar83._12_4_;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + uVar66 + uVar70 + 6);
  auVar83 = vpmovsxwd_avx(auVar123);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar142);
  auVar159._0_4_ = auVar77._0_4_ * auVar83._0_4_;
  auVar159._4_4_ = auVar77._4_4_ * auVar83._4_4_;
  auVar159._8_4_ = auVar77._8_4_ * auVar83._8_4_;
  auVar159._12_4_ = auVar77._12_4_ * auVar83._12_4_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar70 * 0x17 + 6);
  auVar83 = vpmovsxwd_avx(auVar144);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar142);
  auVar76._0_4_ = auVar77._0_4_ * auVar83._0_4_;
  auVar76._4_4_ = auVar77._4_4_ * auVar83._4_4_;
  auVar76._8_4_ = auVar77._8_4_ * auVar83._8_4_;
  auVar76._12_4_ = auVar77._12_4_ * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar182,auVar194);
  auVar184 = vpminsd_avx(auVar218,auVar106);
  auVar83 = vmaxps_avx(auVar83,auVar184);
  auVar184 = vpminsd_avx(auVar159,auVar76);
  uVar71 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar227._4_4_ = uVar71;
  auVar227._0_4_ = uVar71;
  auVar227._8_4_ = uVar71;
  auVar227._12_4_ = uVar71;
  auVar184 = vmaxps_avx(auVar184,auVar227);
  auVar83 = vmaxps_avx(auVar83,auVar184);
  local_430._0_4_ = auVar83._0_4_ * 0.99999964;
  local_430._4_4_ = auVar83._4_4_ * 0.99999964;
  local_430._8_4_ = auVar83._8_4_ * 0.99999964;
  local_430._12_4_ = auVar83._12_4_ * 0.99999964;
  auVar83 = vpmaxsd_avx(auVar182,auVar194);
  auVar184 = vpmaxsd_avx(auVar218,auVar106);
  auVar83 = vminps_avx(auVar83,auVar184);
  auVar184 = vpmaxsd_avx(auVar159,auVar76);
  fVar104 = ray->tfar;
  auVar142._4_4_ = fVar104;
  auVar142._0_4_ = fVar104;
  auVar142._8_4_ = fVar104;
  auVar142._12_4_ = fVar104;
  auVar184 = vminps_avx(auVar184,auVar142);
  auVar83 = vminps_avx(auVar83,auVar184);
  auVar77._0_4_ = auVar83._0_4_ * 1.0000004;
  auVar77._4_4_ = auVar83._4_4_ * 1.0000004;
  auVar77._8_4_ = auVar83._8_4_ * 1.0000004;
  auVar77._12_4_ = auVar83._12_4_ * 1.0000004;
  auVar107[4] = PVar3;
  auVar107._5_3_ = 0;
  auVar107[8] = PVar3;
  auVar107._9_3_ = 0;
  auVar107[0xc] = PVar3;
  auVar107._13_3_ = 0;
  auVar184 = vpcmpgtd_avx(auVar107,_DAT_01ff0cf0);
  auVar83 = vcmpps_avx(local_430,auVar77,2);
  auVar83 = vandps_avx(auVar83,auVar184);
  uVar65 = vmovmskps_avx(auVar83);
  local_af1 = uVar65 != 0;
  if (uVar65 == 0) {
    return local_af1;
  }
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  uVar65 = uVar65 & 0xff;
  local_2a0 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_760 = 0x7fffffff;
  uStack_75c = 0x7fffffff;
  uStack_758 = 0x7fffffff;
  uStack_754 = 0x7fffffff;
  uStack_750 = 0x7fffffff;
  uStack_74c = 0x7fffffff;
  uStack_748 = 0x7fffffff;
  uStack_744 = 0x7fffffff;
  local_790 = prim;
LAB_016e099d:
  lVar68 = 0;
  local_788 = (ulong)uVar65;
  for (uVar66 = local_788; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar68 = lVar68 + 1;
  }
  local_a88 = (ulong)*(uint *)(local_790 + 2);
  local_8e8 = (ulong)*(uint *)(local_790 + lVar68 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_a88].ptr;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8e8);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar68 = *(long *)&pGVar4[1].time_range.upper;
  auVar83 = *(undefined1 (*) [16])(lVar68 + (long)p_Var5 * uVar66);
  auVar184 = *(undefined1 (*) [16])(lVar68 + (uVar66 + 1) * (long)p_Var5);
  auVar234 = *(undefined1 (*) [16])(lVar68 + (uVar66 + 2) * (long)p_Var5);
  local_788 = local_788 - 1 & local_788;
  auVar114 = *(undefined1 (*) [16])(lVar68 + (uVar66 + 3) * (long)p_Var5);
  if (local_788 != 0) {
    uVar70 = local_788 - 1 & local_788;
    for (uVar66 = local_788; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    }
    if (uVar70 != 0) {
      for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar195._0_4_ = (auVar83._0_4_ + auVar184._0_4_ + auVar234._0_4_ + auVar114._0_4_) * 0.25;
  auVar195._4_4_ = (auVar83._4_4_ + auVar184._4_4_ + auVar234._4_4_ + auVar114._4_4_) * 0.25;
  auVar195._8_4_ = (auVar83._8_4_ + auVar184._8_4_ + auVar234._8_4_ + auVar114._8_4_) * 0.25;
  auVar195._12_4_ = (auVar83._12_4_ + auVar184._12_4_ + auVar234._12_4_ + auVar114._12_4_) * 0.25;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar123 = vsubps_avx(auVar195,(undefined1  [16])aVar1);
  auVar123 = vdpps_avx(auVar123,(undefined1  [16])aVar2,0x7f);
  auVar144 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar77 = vrcpss_avx(auVar144,auVar144);
  auVar144 = vfnmadd213ss_fma(auVar77,auVar144,ZEXT416(0x40000000));
  fVar104 = auVar123._0_4_ * auVar77._0_4_ * auVar144._0_4_;
  local_7b0 = ZEXT416((uint)fVar104);
  auVar196._4_4_ = fVar104;
  auVar196._0_4_ = fVar104;
  auVar196._8_4_ = fVar104;
  auVar196._12_4_ = fVar104;
  fStack_850 = fVar104;
  _local_860 = auVar196;
  fStack_84c = fVar104;
  fStack_848 = fVar104;
  fStack_844 = fVar104;
  auVar123 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar196);
  auVar123 = vblendps_avx(auVar123,_DAT_01feba10,8);
  local_a00 = vsubps_avx(auVar83,auVar123);
  local_a10 = vsubps_avx(auVar234,auVar123);
  local_a20 = vsubps_avx(auVar184,auVar123);
  _local_a30 = vsubps_avx(auVar114,auVar123);
  auVar83 = vmovshdup_avx(local_a00);
  local_1a0 = auVar83._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar83 = vshufps_avx(local_a00,local_a00,0xaa);
  uVar73 = auVar83._0_8_;
  local_4a0._8_8_ = uVar73;
  local_4a0._0_8_ = uVar73;
  local_4a0._16_8_ = uVar73;
  local_4a0._24_8_ = uVar73;
  auVar83 = vshufps_avx(local_a00,local_a00,0xff);
  local_1c0 = auVar83._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar83 = vmovshdup_avx(local_a20);
  local_1e0 = auVar83._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar83 = vshufps_avx(local_a20,local_a20,0xaa);
  uVar73 = auVar83._0_8_;
  auVar248._8_8_ = uVar73;
  auVar248._0_8_ = uVar73;
  auVar248._16_8_ = uVar73;
  auVar248._24_8_ = uVar73;
  auVar83 = vshufps_avx(local_a20,local_a20,0xff);
  local_200 = auVar83._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar83 = vmovshdup_avx(local_a10);
  local_360 = auVar83._0_4_;
  fStack_35c = auVar83._4_4_;
  auVar83 = vshufps_avx(local_a10,local_a10,0xaa);
  uVar73 = auVar83._0_8_;
  local_2c0._8_8_ = uVar73;
  local_2c0._0_8_ = uVar73;
  local_2c0._16_8_ = uVar73;
  local_2c0._24_8_ = uVar73;
  auVar83 = vshufps_avx(local_a10,local_a10,0xff);
  local_380 = auVar83._0_4_;
  fStack_37c = auVar83._4_4_;
  auVar83 = vmovshdup_avx(_local_a30);
  local_220 = auVar83._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar83 = vshufps_avx(_local_a30,_local_a30,0xaa);
  local_240 = auVar83._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar83 = vshufps_avx(_local_a30,_local_a30,0xff);
  local_260 = auVar83._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar78._0_4_ = aVar2.x * aVar2.x;
  auVar78._4_4_ = aVar2.y * aVar2.y;
  auVar78._8_4_ = aVar2.z * aVar2.z;
  auVar78._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar83 = vshufps_avx(auVar78,auVar78,0xaa);
  uVar71 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_700._4_4_ = uVar71;
  local_700._0_4_ = uVar71;
  fStack_6f8 = (float)uVar71;
  fStack_6f4 = (float)uVar71;
  fStack_6f0 = (float)uVar71;
  fStack_6ec = (float)uVar71;
  fStack_6e8 = (float)uVar71;
  register0x000014dc = uVar71;
  auVar249 = ZEXT3264(_local_700);
  uVar73 = auVar83._0_8_;
  auVar228._8_8_ = uVar73;
  auVar228._0_8_ = uVar73;
  auVar228._16_8_ = uVar73;
  auVar228._24_8_ = uVar73;
  auVar83 = vfmadd231ps_fma(auVar228,_local_700,_local_700);
  uVar71 = *(undefined4 *)&(ray->dir).field_0;
  local_720._4_4_ = uVar71;
  local_720._0_4_ = uVar71;
  fStack_718 = (float)uVar71;
  fStack_714 = (float)uVar71;
  fStack_710 = (float)uVar71;
  fStack_70c = (float)uVar71;
  fStack_708 = (float)uVar71;
  register0x000015dc = uVar71;
  auVar275 = ZEXT3264(_local_720);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),_local_720,_local_720);
  auVar231 = ZEXT1664(auVar83);
  local_5c0 = 1;
  uVar66 = 0;
  bVar67 = 0;
  local_4c0 = (ray->dir).field_0.m128[2];
  uVar71 = local_a00._0_4_;
  local_2e0._4_4_ = uVar71;
  local_2e0._0_4_ = uVar71;
  local_2e0._8_4_ = uVar71;
  local_2e0._12_4_ = uVar71;
  local_2e0._16_4_ = uVar71;
  local_2e0._20_4_ = uVar71;
  local_2e0._24_4_ = uVar71;
  local_2e0._28_4_ = uVar71;
  uVar71 = local_a20._0_4_;
  local_960._4_4_ = uVar71;
  local_960._0_4_ = uVar71;
  local_960._8_4_ = uVar71;
  local_960._12_4_ = uVar71;
  local_960._16_4_ = uVar71;
  local_960._20_4_ = uVar71;
  local_960._24_4_ = uVar71;
  local_960._28_4_ = uVar71;
  auVar216 = ZEXT3264(local_960);
  uVar71 = local_a10._0_4_;
  local_300._4_4_ = uVar71;
  local_300._0_4_ = uVar71;
  local_300._8_4_ = uVar71;
  local_300._12_4_ = uVar71;
  local_300._16_4_ = uVar71;
  local_300._20_4_ = uVar71;
  local_300._24_4_ = uVar71;
  local_300._28_4_ = uVar71;
  local_320 = local_a30._0_4_;
  auVar7._4_4_ = uStack_75c;
  auVar7._0_4_ = local_760;
  auVar7._8_4_ = uStack_758;
  auVar7._12_4_ = uStack_754;
  auVar7._16_4_ = uStack_750;
  auVar7._20_4_ = uStack_74c;
  auVar7._24_4_ = uStack_748;
  auVar7._28_4_ = uStack_744;
  local_3a0 = vandps_avx(ZEXT1632(auVar83),auVar7);
  local_7a0 = ZEXT816(0x3f80000000000000);
  local_280 = ZEXT1632(auVar83);
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_940 = auVar248;
  fStack_4bc = local_4c0;
  fStack_4b8 = local_4c0;
  fStack_4b4 = local_4c0;
  fStack_4b0 = local_4c0;
  fStack_4ac = local_4c0;
  fStack_4a8 = local_4c0;
  fStack_4a4 = local_4c0;
  fStack_378 = local_380;
  fStack_374 = fStack_37c;
  fStack_370 = local_380;
  fStack_36c = fStack_37c;
  fStack_368 = local_380;
  fStack_364 = fStack_37c;
  fStack_358 = local_360;
  fStack_354 = fStack_35c;
  fStack_350 = local_360;
  fStack_34c = fStack_35c;
  fStack_348 = local_360;
  fStack_344 = fStack_35c;
  do {
    auVar174._8_4_ = 0x3f800000;
    auVar174._0_8_ = &DAT_3f8000003f800000;
    auVar174._12_4_ = 0x3f800000;
    auVar174._16_4_ = 0x3f800000;
    auVar174._20_4_ = 0x3f800000;
    auVar174._24_4_ = 0x3f800000;
    auVar174._28_4_ = 0x3f800000;
    auVar83 = vmovshdup_avx(local_7a0);
    local_660._0_4_ = local_7a0._0_4_;
    fVar137 = auVar83._0_4_ - (float)local_660._0_4_;
    fVar141 = fVar137 * 0.04761905;
    local_660._4_4_ = local_660._0_4_;
    local_660._8_4_ = local_660._0_4_;
    local_660._12_4_ = local_660._0_4_;
    local_660._16_4_ = local_660._0_4_;
    local_660._20_4_ = local_660._0_4_;
    local_660._24_4_ = local_660._0_4_;
    local_660._28_4_ = local_660._0_4_;
    auVar87._4_4_ = fVar137;
    auVar87._0_4_ = fVar137;
    auVar87._8_4_ = fVar137;
    auVar87._12_4_ = fVar137;
    auVar87._16_4_ = fVar137;
    auVar87._20_4_ = fVar137;
    auVar87._24_4_ = fVar137;
    auVar87._28_4_ = fVar137;
    auVar83 = vfmadd231ps_fma(local_660,auVar87,_DAT_02020f20);
    auVar97 = vsubps_avx(auVar174,ZEXT1632(auVar83));
    fVar104 = auVar83._0_4_;
    auVar101._0_4_ = auVar216._0_4_ * fVar104;
    fVar72 = auVar83._4_4_;
    auVar101._4_4_ = auVar216._4_4_ * fVar72;
    fVar136 = auVar83._8_4_;
    auVar101._8_4_ = auVar216._8_4_ * fVar136;
    fVar224 = auVar83._12_4_;
    auVar101._12_4_ = auVar216._12_4_ * fVar224;
    auVar101._16_4_ = auVar216._16_4_ * 0.0;
    auVar101._20_4_ = auVar216._20_4_ * 0.0;
    auVar101._28_36_ = auVar249._28_36_;
    auVar101._24_4_ = auVar216._24_4_ * 0.0;
    auVar62._8_8_ = uStack_1d8;
    auVar62._0_8_ = local_1e0;
    auVar62._16_8_ = uStack_1d0;
    auVar62._24_8_ = uStack_1c8;
    auVar276._0_4_ = (float)local_1e0 * fVar104;
    auVar276._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar72;
    auVar276._8_4_ = (float)uStack_1d8 * fVar136;
    auVar276._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar224;
    auVar276._16_4_ = (float)uStack_1d0 * 0.0;
    auVar276._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar276._28_36_ = auVar275._28_36_;
    auVar276._24_4_ = (float)uStack_1c8 * 0.0;
    auVar249._0_4_ = auVar248._0_4_ * fVar104;
    auVar249._4_4_ = auVar248._4_4_ * fVar72;
    auVar249._8_4_ = auVar248._8_4_ * fVar136;
    auVar249._12_4_ = auVar248._12_4_ * fVar224;
    auVar249._16_4_ = auVar248._16_4_ * 0.0;
    auVar249._20_4_ = auVar248._20_4_ * 0.0;
    auVar249._28_36_ = auVar231._28_36_;
    auVar249._24_4_ = auVar248._24_4_ * 0.0;
    auVar61._8_8_ = uStack_1f8;
    auVar61._0_8_ = local_200;
    auVar61._16_8_ = uStack_1f0;
    auVar61._24_8_ = uStack_1e8;
    auVar8._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar72;
    auVar8._0_4_ = (float)local_200 * fVar104;
    auVar8._8_4_ = (float)uStack_1f8 * fVar136;
    auVar8._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar224;
    auVar8._16_4_ = (float)uStack_1f0 * 0.0;
    auVar8._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar8._24_4_ = (float)uStack_1e8 * 0.0;
    auVar8._28_4_ = fVar137;
    auVar83 = vfmadd231ps_fma(auVar101._0_32_,auVar97,local_2e0);
    auVar64._8_8_ = uStack_198;
    auVar64._0_8_ = local_1a0;
    auVar64._16_8_ = uStack_190;
    auVar64._24_8_ = uStack_188;
    auVar184 = vfmadd231ps_fma(auVar276._0_32_,auVar97,auVar64);
    auVar234 = vfmadd231ps_fma(auVar249._0_32_,auVar97,local_4a0);
    auVar63._8_8_ = uStack_1b8;
    auVar63._0_8_ = local_1c0;
    auVar63._16_8_ = uStack_1b0;
    auVar63._24_8_ = uStack_1a8;
    auVar114 = vfmadd231ps_fma(auVar8,auVar97,auVar63);
    auVar149._4_4_ = local_300._4_4_ * fVar72;
    auVar149._0_4_ = local_300._0_4_ * fVar104;
    auVar149._8_4_ = local_300._8_4_ * fVar136;
    auVar149._12_4_ = local_300._12_4_ * fVar224;
    auVar149._16_4_ = local_300._16_4_ * 0.0;
    auVar149._20_4_ = local_300._20_4_ * 0.0;
    auVar149._24_4_ = local_300._24_4_ * 0.0;
    auVar149._28_4_ = local_2e0._28_4_;
    auVar178._4_4_ = fVar72 * fStack_35c;
    auVar178._0_4_ = fVar104 * local_360;
    auVar178._8_4_ = fVar136 * fStack_358;
    auVar178._12_4_ = fVar224 * fStack_354;
    auVar178._16_4_ = fStack_350 * 0.0;
    auVar178._20_4_ = fStack_34c * 0.0;
    auVar178._24_4_ = fStack_348 * 0.0;
    auVar178._28_4_ = local_300._28_4_;
    auVar47._4_4_ = local_2c0._4_4_ * fVar72;
    auVar47._0_4_ = local_2c0._0_4_ * fVar104;
    auVar47._8_4_ = local_2c0._8_4_ * fVar136;
    auVar47._12_4_ = local_2c0._12_4_ * fVar224;
    auVar47._16_4_ = local_2c0._16_4_ * 0.0;
    auVar47._20_4_ = local_2c0._20_4_ * 0.0;
    auVar47._24_4_ = local_2c0._24_4_ * 0.0;
    auVar47._28_4_ = local_4a0._28_4_;
    auVar46._4_4_ = fVar72 * fStack_37c;
    auVar46._0_4_ = fVar104 * local_380;
    auVar46._8_4_ = fVar136 * fStack_378;
    auVar46._12_4_ = fVar224 * fStack_374;
    auVar46._16_4_ = fStack_370 * 0.0;
    auVar46._20_4_ = fStack_36c * 0.0;
    auVar46._24_4_ = fStack_368 * 0.0;
    auVar46._28_4_ = 0x3f800000;
    auVar123 = vfmadd231ps_fma(auVar149,auVar97,auVar216._0_32_);
    auVar144 = vfmadd231ps_fma(auVar178,auVar97,auVar62);
    auVar77 = vfmadd231ps_fma(auVar47,auVar97,auVar248);
    auVar76 = vfmadd231ps_fma(auVar46,auVar97,auVar61);
    auVar90._4_4_ = fStack_31c * fVar72;
    auVar90._0_4_ = local_320 * fVar104;
    auVar90._8_4_ = fStack_318 * fVar136;
    auVar90._12_4_ = fStack_314 * fVar224;
    auVar90._16_4_ = fStack_310 * 0.0;
    auVar90._20_4_ = fStack_30c * 0.0;
    auVar90._24_4_ = fStack_308 * 0.0;
    auVar90._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar151._4_4_ = fVar72 * local_220._4_4_;
    auVar151._0_4_ = fVar104 * (float)local_220;
    auVar151._8_4_ = fVar136 * (float)uStack_218;
    auVar151._12_4_ = fVar224 * uStack_218._4_4_;
    auVar151._16_4_ = (float)uStack_210 * 0.0;
    auVar151._20_4_ = uStack_210._4_4_ * 0.0;
    auVar151._24_4_ = (float)uStack_208 * 0.0;
    auVar151._28_4_ = auVar248._28_4_;
    auVar270._28_4_ = fStack_304;
    auVar270._0_28_ =
         ZEXT1628(CONCAT412(auVar123._12_4_ * fVar224,
                            CONCAT48(auVar123._8_4_ * fVar136,
                                     CONCAT44(auVar123._4_4_ * fVar72,auVar123._0_4_ * fVar104))));
    auVar83 = vfmadd231ps_fma(auVar270,auVar97,ZEXT1632(auVar83));
    auVar184 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar224 * auVar144._12_4_,
                                                  CONCAT48(fVar136 * auVar144._8_4_,
                                                           CONCAT44(fVar72 * auVar144._4_4_,
                                                                    fVar104 * auVar144._0_4_)))),
                               auVar97,ZEXT1632(auVar184));
    auVar9._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar9._0_28_ =
         ZEXT1628(CONCAT412(fVar224 * auVar77._12_4_,
                            CONCAT48(fVar136 * auVar77._8_4_,
                                     CONCAT44(fVar72 * auVar77._4_4_,fVar104 * auVar77._0_4_))));
    auVar234 = vfmadd231ps_fma(auVar9,auVar97,ZEXT1632(auVar234));
    auVar114 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar224 * auVar76._12_4_,
                                                  CONCAT48(fVar136 * auVar76._8_4_,
                                                           CONCAT44(fVar72 * auVar76._4_4_,
                                                                    fVar104 * auVar76._0_4_)))),
                               auVar97,ZEXT1632(auVar114));
    auVar231._0_4_ = fVar104 * (float)local_240;
    auVar231._4_4_ = fVar72 * local_240._4_4_;
    auVar231._8_4_ = fVar136 * (float)uStack_238;
    auVar231._12_4_ = fVar224 * uStack_238._4_4_;
    auVar231._16_4_ = (float)uStack_230 * 0.0;
    auVar231._20_4_ = uStack_230._4_4_ * 0.0;
    auVar231._28_36_ = auVar216._28_36_;
    auVar231._24_4_ = (float)uStack_228 * 0.0;
    auVar142 = vfmadd231ps_fma(auVar90,auVar97,local_300);
    auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar142._12_4_ * fVar224,
                                                  CONCAT48(auVar142._8_4_ * fVar136,
                                                           CONCAT44(auVar142._4_4_ * fVar72,
                                                                    auVar142._0_4_ * fVar104)))),
                               auVar97,ZEXT1632(auVar123));
    auVar219._0_4_ = fVar104 * (float)local_260;
    auVar219._4_4_ = fVar72 * local_260._4_4_;
    auVar219._8_4_ = fVar136 * (float)uStack_258;
    auVar219._12_4_ = fVar224 * uStack_258._4_4_;
    auVar219._16_4_ = (float)uStack_250 * 0.0;
    auVar219._20_4_ = uStack_250._4_4_ * 0.0;
    auVar219._24_4_ = (float)uStack_248 * 0.0;
    auVar219._28_4_ = 0;
    auVar60._4_4_ = fStack_35c;
    auVar60._0_4_ = local_360;
    auVar60._8_4_ = fStack_358;
    auVar60._12_4_ = fStack_354;
    auVar60._16_4_ = fStack_350;
    auVar60._20_4_ = fStack_34c;
    auVar60._24_4_ = fStack_348;
    auVar60._28_4_ = fStack_344;
    auVar142 = vfmadd231ps_fma(auVar151,auVar97,auVar60);
    auVar106 = vfmadd231ps_fma(auVar231._0_32_,auVar97,local_2c0);
    auVar59._4_4_ = fStack_37c;
    auVar59._0_4_ = local_380;
    auVar59._8_4_ = fStack_378;
    auVar59._12_4_ = fStack_374;
    auVar59._16_4_ = fStack_370;
    auVar59._20_4_ = fStack_36c;
    auVar59._24_4_ = fStack_368;
    auVar59._28_4_ = fStack_364;
    auVar75 = vfmadd231ps_fma(auVar219,auVar97,auVar59);
    auVar11._28_4_ = local_2c0._28_4_;
    auVar11._0_28_ =
         ZEXT1628(CONCAT412(auVar75._12_4_ * fVar224,
                            CONCAT48(auVar75._8_4_ * fVar136,
                                     CONCAT44(auVar75._4_4_ * fVar72,auVar75._0_4_ * fVar104))));
    auVar144 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar142._12_4_ * fVar224,
                                                  CONCAT48(auVar142._8_4_ * fVar136,
                                                           CONCAT44(auVar142._4_4_ * fVar72,
                                                                    auVar142._0_4_ * fVar104)))),
                               auVar97,ZEXT1632(auVar144));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar224 * auVar106._12_4_,
                                                 CONCAT48(fVar136 * auVar106._8_4_,
                                                          CONCAT44(fVar72 * auVar106._4_4_,
                                                                   fVar104 * auVar106._0_4_)))),
                              auVar97,ZEXT1632(auVar77));
    auVar76 = vfmadd231ps_fma(auVar11,auVar97,ZEXT1632(auVar76));
    auVar88._28_4_ = local_300._28_4_;
    auVar88._0_28_ =
         ZEXT1628(CONCAT412(auVar144._12_4_ * fVar224,
                            CONCAT48(auVar144._8_4_ * fVar136,
                                     CONCAT44(auVar144._4_4_ * fVar72,auVar144._0_4_ * fVar104))));
    auVar142 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar123._12_4_ * fVar224,
                                                  CONCAT48(auVar123._8_4_ * fVar136,
                                                           CONCAT44(auVar123._4_4_ * fVar72,
                                                                    auVar123._0_4_ * fVar104)))),
                               auVar97,ZEXT1632(auVar83));
    auVar106 = vfmadd231ps_fma(auVar88,auVar97,ZEXT1632(auVar184));
    auVar88 = ZEXT1632(auVar106);
    auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar224 * auVar77._12_4_,
                                                  CONCAT48(fVar136 * auVar77._8_4_,
                                                           CONCAT44(fVar72 * auVar77._4_4_,
                                                                    fVar104 * auVar77._0_4_)))),
                               auVar97,ZEXT1632(auVar234));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar76._12_4_ * fVar224,
                                                 CONCAT48(auVar76._8_4_ * fVar136,
                                                          CONCAT44(auVar76._4_4_ * fVar72,
                                                                   auVar76._0_4_ * fVar104)))),
                              ZEXT1632(auVar114),auVar97);
    auVar248 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar83));
    auVar97 = vsubps_avx(ZEXT1632(auVar144),ZEXT1632(auVar184));
    auVar7 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar234));
    auVar228 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar114));
    auVar208._0_4_ = fVar141 * auVar248._0_4_ * 3.0;
    auVar208._4_4_ = fVar141 * auVar248._4_4_ * 3.0;
    auVar208._8_4_ = fVar141 * auVar248._8_4_ * 3.0;
    auVar208._12_4_ = fVar141 * auVar248._12_4_ * 3.0;
    auVar208._16_4_ = fVar141 * auVar248._16_4_ * 3.0;
    auVar208._20_4_ = fVar141 * auVar248._20_4_ * 3.0;
    auVar208._24_4_ = fVar141 * auVar248._24_4_ * 3.0;
    local_820._28_4_ = 0;
    local_820._0_28_ = auVar208;
    local_840._0_4_ = fVar141 * auVar97._0_4_ * 3.0;
    local_840._4_4_ = fVar141 * auVar97._4_4_ * 3.0;
    fStack_838 = fVar141 * auVar97._8_4_ * 3.0;
    fStack_834 = fVar141 * auVar97._12_4_ * 3.0;
    register0x000013d0 = fVar141 * auVar97._16_4_ * 3.0;
    register0x000013d4 = fVar141 * auVar97._20_4_ * 3.0;
    register0x000013d8 = fVar141 * auVar97._24_4_ * 3.0;
    register0x000013dc = 0;
    local_980._0_4_ = fVar141 * auVar7._0_4_ * 3.0;
    local_980._4_4_ = fVar141 * auVar7._4_4_ * 3.0;
    local_980._8_4_ = fVar141 * auVar7._8_4_ * 3.0;
    local_980._12_4_ = fVar141 * auVar7._12_4_ * 3.0;
    local_980._16_4_ = fVar141 * auVar7._16_4_ * 3.0;
    local_980._20_4_ = fVar141 * auVar7._20_4_ * 3.0;
    local_980._24_4_ = fVar141 * auVar7._24_4_ * 3.0;
    local_980._28_4_ = 0;
    fVar104 = fVar141 * auVar228._0_4_ * 3.0;
    fVar136 = fVar141 * auVar228._4_4_ * 3.0;
    auVar91._4_4_ = fVar136;
    auVar91._0_4_ = fVar104;
    fVar137 = fVar141 * auVar228._8_4_ * 3.0;
    auVar91._8_4_ = fVar137;
    fVar138 = fVar141 * auVar228._12_4_ * 3.0;
    auVar91._12_4_ = fVar138;
    fVar139 = fVar141 * auVar228._16_4_ * 3.0;
    auVar91._16_4_ = fVar139;
    fVar140 = fVar141 * auVar228._20_4_ * 3.0;
    auVar91._20_4_ = fVar140;
    fVar141 = fVar141 * auVar228._24_4_ * 3.0;
    auVar91._24_4_ = fVar141;
    auVar91._28_4_ = auVar248._28_4_;
    local_a80 = ZEXT1632(auVar142);
    auVar9 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar142));
    local_7e0 = vpermps_avx2(_DAT_0205d4a0,auVar88);
    local_800 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar106));
    auVar8 = vsubps_avx(auVar9,local_a80);
    auVar149 = vsubps_avx(local_800,ZEXT1632(auVar106));
    fVar155 = auVar149._0_4_;
    fVar156 = auVar149._4_4_;
    auVar271._4_4_ = fVar156 * auVar208._4_4_;
    auVar271._0_4_ = fVar155 * auVar208._0_4_;
    fVar157 = auVar149._8_4_;
    auVar271._8_4_ = fVar157 * auVar208._8_4_;
    fVar158 = auVar149._12_4_;
    auVar271._12_4_ = fVar158 * auVar208._12_4_;
    fVar238 = auVar149._16_4_;
    auVar271._16_4_ = fVar238 * auVar208._16_4_;
    fVar240 = auVar149._20_4_;
    auVar271._20_4_ = fVar240 * auVar208._20_4_;
    fVar241 = auVar149._24_4_;
    auVar271._24_4_ = fVar241 * auVar208._24_4_;
    auVar271._28_4_ = local_800._28_4_;
    auVar83 = vfmsub231ps_fma(auVar271,local_980,auVar8);
    auVar178 = vsubps_avx(local_7e0,auVar88);
    fVar242 = auVar8._0_4_;
    fVar250 = auVar8._4_4_;
    auVar273._4_4_ = fVar250 * (float)local_840._4_4_;
    auVar273._0_4_ = fVar242 * (float)local_840._0_4_;
    fVar251 = auVar8._8_4_;
    auVar273._8_4_ = fVar251 * fStack_838;
    fVar252 = auVar8._12_4_;
    auVar273._12_4_ = fVar252 * fStack_834;
    fVar253 = auVar8._16_4_;
    auVar273._16_4_ = fVar253 * register0x000013d0;
    fVar254 = auVar8._20_4_;
    auVar273._20_4_ = fVar254 * register0x000013d4;
    fVar255 = auVar8._24_4_;
    auVar273._24_4_ = fVar255 * register0x000013d8;
    auVar273._28_4_ = auVar9._28_4_;
    auVar184 = vfmsub231ps_fma(auVar273,local_820,auVar178);
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar184._12_4_ * auVar184._12_4_,
                                                 CONCAT48(auVar184._8_4_ * auVar184._8_4_,
                                                          CONCAT44(auVar184._4_4_ * auVar184._4_4_,
                                                                   auVar184._0_4_ * auVar184._0_4_))
                                                )),ZEXT1632(auVar83),ZEXT1632(auVar83));
    fVar232 = auVar178._0_4_;
    fVar235 = auVar178._4_4_;
    auVar210._4_4_ = fVar235 * local_980._4_4_;
    auVar210._0_4_ = fVar232 * local_980._0_4_;
    fVar236 = auVar178._8_4_;
    auVar210._8_4_ = fVar236 * local_980._8_4_;
    fVar237 = auVar178._12_4_;
    auVar210._12_4_ = fVar237 * local_980._12_4_;
    fVar239 = auVar178._16_4_;
    auVar210._16_4_ = fVar239 * local_980._16_4_;
    fVar258 = auVar178._20_4_;
    auVar210._20_4_ = fVar258 * local_980._20_4_;
    fVar259 = auVar178._24_4_;
    auVar210._24_4_ = fVar259 * local_980._24_4_;
    auVar210._28_4_ = local_7e0._28_4_;
    auVar234 = vfmsub231ps_fma(auVar210,_local_840,auVar149);
    auVar175._0_4_ = fVar155 * fVar155;
    auVar175._4_4_ = fVar156 * fVar156;
    auVar175._8_4_ = fVar157 * fVar157;
    auVar175._12_4_ = fVar158 * fVar158;
    auVar175._16_4_ = fVar238 * fVar238;
    auVar175._20_4_ = fVar240 * fVar240;
    auVar175._24_4_ = fVar241 * fVar241;
    auVar175._28_4_ = 0;
    auVar184 = vfmadd231ps_fma(auVar175,auVar178,auVar178);
    auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar8,auVar8);
    auVar97 = vrcpps_avx(ZEXT1632(auVar184));
    auVar234 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar234),ZEXT1632(auVar234));
    auVar260._8_4_ = 0x3f800000;
    auVar260._0_8_ = &DAT_3f8000003f800000;
    auVar260._12_4_ = 0x3f800000;
    auVar260._16_4_ = 0x3f800000;
    auVar260._20_4_ = 0x3f800000;
    auVar260._24_4_ = 0x3f800000;
    auVar260._28_4_ = 0x3f800000;
    auVar83 = vfnmadd213ps_fma(auVar97,ZEXT1632(auVar184),auVar260);
    auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar97,auVar97);
    local_640 = vpermps_avx2(_DAT_0205d4a0,local_820);
    local_a60 = vpermps_avx2(_DAT_0205d4a0,local_980);
    auVar6._4_4_ = fVar156 * local_640._4_4_;
    auVar6._0_4_ = fVar155 * local_640._0_4_;
    auVar6._8_4_ = fVar157 * local_640._8_4_;
    auVar6._12_4_ = fVar158 * local_640._12_4_;
    auVar6._16_4_ = fVar238 * local_640._16_4_;
    auVar6._20_4_ = fVar240 * local_640._20_4_;
    auVar6._24_4_ = fVar241 * local_640._24_4_;
    auVar6._28_4_ = auVar97._28_4_;
    auVar114 = vfmsub231ps_fma(auVar6,local_a60,auVar8);
    local_8e0 = vpermps_avx2(_DAT_0205d4a0,_local_840);
    auVar12._4_4_ = fVar250 * local_8e0._4_4_;
    auVar12._0_4_ = fVar242 * local_8e0._0_4_;
    auVar12._8_4_ = fVar251 * local_8e0._8_4_;
    auVar12._12_4_ = fVar252 * local_8e0._12_4_;
    auVar12._16_4_ = fVar253 * local_8e0._16_4_;
    auVar12._20_4_ = fVar254 * local_8e0._20_4_;
    auVar12._24_4_ = fVar255 * local_8e0._24_4_;
    auVar12._28_4_ = 0;
    auVar123 = vfmsub231ps_fma(auVar12,local_640,auVar178);
    auVar114 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar123._12_4_ * auVar123._12_4_,
                                                  CONCAT48(auVar123._8_4_ * auVar123._8_4_,
                                                           CONCAT44(auVar123._4_4_ * auVar123._4_4_,
                                                                    auVar123._0_4_ * auVar123._0_4_)
                                                          ))),ZEXT1632(auVar114),ZEXT1632(auVar114))
    ;
    fVar72 = local_a60._0_4_;
    auVar202._0_4_ = fVar232 * fVar72;
    fVar224 = local_a60._4_4_;
    auVar202._4_4_ = fVar235 * fVar224;
    fVar225 = local_a60._8_4_;
    auVar202._8_4_ = fVar236 * fVar225;
    fVar226 = local_a60._12_4_;
    auVar202._12_4_ = fVar237 * fVar226;
    fVar277 = local_a60._16_4_;
    auVar202._16_4_ = fVar239 * fVar277;
    fVar278 = local_a60._20_4_;
    auVar202._20_4_ = fVar258 * fVar278;
    fVar279 = local_a60._24_4_;
    auVar202._24_4_ = fVar259 * fVar279;
    auVar202._28_4_ = 0;
    auVar123 = vfmsub231ps_fma(auVar202,local_8e0,auVar149);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),ZEXT1632(auVar123),ZEXT1632(auVar123));
    auVar97 = vmaxps_avx(ZEXT1632(CONCAT412(auVar234._12_4_ * auVar83._12_4_,
                                            CONCAT48(auVar234._8_4_ * auVar83._8_4_,
                                                     CONCAT44(auVar234._4_4_ * auVar83._4_4_,
                                                              auVar234._0_4_ * auVar83._0_4_)))),
                         ZEXT1632(CONCAT412(auVar114._12_4_ * auVar83._12_4_,
                                            CONCAT48(auVar114._8_4_ * auVar83._8_4_,
                                                     CONCAT44(auVar114._4_4_ * auVar83._4_4_,
                                                              auVar114._0_4_ * auVar83._0_4_)))));
    local_8c0._0_4_ = auVar75._0_4_ + fVar104;
    local_8c0._4_4_ = auVar75._4_4_ + fVar136;
    local_8c0._8_4_ = auVar75._8_4_ + fVar137;
    local_8c0._12_4_ = auVar75._12_4_ + fVar138;
    local_8c0._16_4_ = fVar139 + 0.0;
    local_8c0._20_4_ = fVar140 + 0.0;
    local_8c0._24_4_ = fVar141 + 0.0;
    local_8c0._28_4_ = auVar248._28_4_ + 0.0;
    local_8a0 = ZEXT1632(auVar75);
    auVar248 = vsubps_avx(local_8a0,auVar91);
    local_880 = vpermps_avx2(_DAT_0205d4a0,auVar248);
    local_680 = vpermps_avx2(_DAT_0205d4a0,local_8a0);
    auVar248 = vmaxps_avx(local_8a0,local_8c0);
    auVar7 = vmaxps_avx(local_880,local_680);
    auVar228 = vrsqrtps_avx(ZEXT1632(auVar184));
    auVar248 = vmaxps_avx(auVar248,auVar7);
    fVar104 = auVar228._0_4_;
    fVar136 = auVar228._4_4_;
    fVar141 = auVar228._8_4_;
    fVar137 = auVar228._12_4_;
    fVar138 = auVar228._16_4_;
    fVar139 = auVar228._20_4_;
    fVar140 = auVar228._24_4_;
    auVar13._4_4_ = fVar136 * fVar136 * fVar136 * auVar184._4_4_ * -0.5;
    auVar13._0_4_ = fVar104 * fVar104 * fVar104 * auVar184._0_4_ * -0.5;
    auVar13._8_4_ = fVar141 * fVar141 * fVar141 * auVar184._8_4_ * -0.5;
    auVar13._12_4_ = fVar137 * fVar137 * fVar137 * auVar184._12_4_ * -0.5;
    auVar13._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
    auVar13._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
    auVar13._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
    auVar13._28_4_ = auVar7._28_4_;
    auVar89._8_4_ = 0x3fc00000;
    auVar89._0_8_ = 0x3fc000003fc00000;
    auVar89._12_4_ = 0x3fc00000;
    auVar89._16_4_ = 0x3fc00000;
    auVar89._20_4_ = 0x3fc00000;
    auVar89._24_4_ = 0x3fc00000;
    auVar89._28_4_ = 0x3fc00000;
    auVar83 = vfmadd231ps_fma(auVar13,auVar89,auVar228);
    fVar136 = auVar83._0_4_;
    fVar141 = auVar83._4_4_;
    auVar14._4_4_ = fVar235 * fVar141;
    auVar14._0_4_ = fVar232 * fVar136;
    fVar138 = auVar83._8_4_;
    auVar14._8_4_ = fVar236 * fVar138;
    fVar140 = auVar83._12_4_;
    auVar14._12_4_ = fVar237 * fVar140;
    auVar14._16_4_ = fVar239 * 0.0;
    auVar14._20_4_ = fVar258 * 0.0;
    auVar14._24_4_ = fVar259 * 0.0;
    auVar14._28_4_ = 0;
    auVar15._4_4_ = fStack_4bc * fVar156 * fVar141;
    auVar15._0_4_ = local_4c0 * fVar155 * fVar136;
    auVar15._8_4_ = fStack_4b8 * fVar157 * fVar138;
    auVar15._12_4_ = fStack_4b4 * fVar158 * fVar140;
    auVar15._16_4_ = fStack_4b0 * fVar238 * 0.0;
    auVar15._20_4_ = fStack_4ac * fVar240 * 0.0;
    auVar15._24_4_ = fStack_4a8 * fVar241 * 0.0;
    auVar15._28_4_ = local_640._28_4_;
    auVar83 = vfmadd231ps_fma(auVar15,auVar14,_local_700);
    auVar271 = ZEXT1632(auVar106);
    auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar7 = vsubps_avx(auVar90,auVar271);
    fVar232 = auVar7._0_4_;
    auVar272._0_4_ = fVar232 * fVar155 * fVar136;
    fVar235 = auVar7._4_4_;
    auVar272._4_4_ = fVar235 * fVar156 * fVar141;
    fVar236 = auVar7._8_4_;
    auVar272._8_4_ = fVar236 * fVar157 * fVar138;
    fVar237 = auVar7._12_4_;
    auVar272._12_4_ = fVar237 * fVar158 * fVar140;
    fVar239 = auVar7._16_4_;
    auVar272._16_4_ = fVar239 * fVar238 * 0.0;
    fVar238 = auVar7._20_4_;
    auVar272._20_4_ = fVar238 * fVar240 * 0.0;
    fVar240 = auVar7._24_4_;
    auVar272._24_4_ = fVar240 * fVar241 * 0.0;
    auVar272._28_4_ = 0;
    auVar90 = vsubps_avx(auVar90,auVar88);
    auVar184 = vfmadd231ps_fma(auVar272,auVar90,auVar14);
    auVar16._4_4_ = fVar250 * fVar141;
    auVar16._0_4_ = fVar242 * fVar136;
    auVar16._8_4_ = fVar251 * fVar138;
    auVar16._12_4_ = fVar252 * fVar140;
    auVar16._16_4_ = fVar253 * 0.0;
    auVar16._20_4_ = fVar254 * 0.0;
    auVar16._24_4_ = fVar255 * 0.0;
    auVar16._28_4_ = auVar228._28_4_;
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar16,_local_720);
    auVar91 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar151 = vsubps_avx(auVar91,local_a80);
    auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar151,auVar16);
    auVar17._4_4_ = fVar235 * fStack_4bc;
    auVar17._0_4_ = fVar232 * local_4c0;
    auVar17._8_4_ = fVar236 * fStack_4b8;
    auVar17._12_4_ = fVar237 * fStack_4b4;
    auVar17._16_4_ = fVar239 * fStack_4b0;
    auVar17._20_4_ = fVar238 * fStack_4ac;
    auVar17._24_4_ = fVar240 * fStack_4a8;
    auVar17._28_4_ = auVar228._28_4_;
    auVar234 = vfmadd231ps_fma(auVar17,_local_700,auVar90);
    auVar234 = vfmadd231ps_fma(ZEXT1632(auVar234),_local_720,auVar151);
    fVar104 = auVar184._0_4_;
    fVar241 = auVar83._0_4_;
    fVar137 = auVar184._4_4_;
    fVar242 = auVar83._4_4_;
    fVar139 = auVar184._8_4_;
    fVar250 = auVar83._8_4_;
    fVar155 = auVar184._12_4_;
    fVar251 = auVar83._12_4_;
    auVar18._28_4_ = fStack_4a4;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(fVar251 * fVar155,
                            CONCAT48(fVar250 * fVar139,CONCAT44(fVar242 * fVar137,fVar241 * fVar104)
                                    )));
    auVar228 = vsubps_avx(ZEXT1632(auVar234),auVar18);
    auVar19._4_4_ = fVar235 * fVar235;
    auVar19._0_4_ = fVar232 * fVar232;
    auVar19._8_4_ = fVar236 * fVar236;
    auVar19._12_4_ = fVar237 * fVar237;
    auVar19._16_4_ = fVar239 * fVar239;
    auVar19._20_4_ = fVar238 * fVar238;
    auVar19._24_4_ = fVar240 * fVar240;
    auVar19._28_4_ = fStack_4a4;
    auVar234 = vfmadd231ps_fma(auVar19,auVar90,auVar90);
    auVar234 = vfmadd231ps_fma(ZEXT1632(auVar234),auVar151,auVar151);
    auVar20._28_4_ = auVar8._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar155 * fVar155,
                            CONCAT48(fVar139 * fVar139,CONCAT44(fVar137 * fVar137,fVar104 * fVar104)
                                    )));
    local_6a0 = vsubps_avx(ZEXT1632(auVar234),auVar20);
    auVar7 = vsqrtps_avx(auVar97);
    fVar104 = (auVar7._0_4_ + auVar248._0_4_) * 1.0000002;
    fVar137 = (auVar7._4_4_ + auVar248._4_4_) * 1.0000002;
    fVar139 = (auVar7._8_4_ + auVar248._8_4_) * 1.0000002;
    fVar155 = (auVar7._12_4_ + auVar248._12_4_) * 1.0000002;
    fVar156 = (auVar7._16_4_ + auVar248._16_4_) * 1.0000002;
    fVar157 = (auVar7._20_4_ + auVar248._20_4_) * 1.0000002;
    fVar158 = (auVar7._24_4_ + auVar248._24_4_) * 1.0000002;
    auVar21._4_4_ = fVar137 * fVar137;
    auVar21._0_4_ = fVar104 * fVar104;
    auVar21._8_4_ = fVar139 * fVar139;
    auVar21._12_4_ = fVar155 * fVar155;
    auVar21._16_4_ = fVar156 * fVar156;
    auVar21._20_4_ = fVar157 * fVar157;
    auVar21._24_4_ = fVar158 * fVar158;
    auVar21._28_4_ = auVar7._28_4_ + auVar248._28_4_;
    fVar137 = auVar228._0_4_ + auVar228._0_4_;
    fVar139 = auVar228._4_4_ + auVar228._4_4_;
    auVar229._0_8_ = CONCAT44(fVar139,fVar137);
    auVar229._8_4_ = auVar228._8_4_ + auVar228._8_4_;
    auVar229._12_4_ = auVar228._12_4_ + auVar228._12_4_;
    auVar229._16_4_ = auVar228._16_4_ + auVar228._16_4_;
    auVar229._20_4_ = auVar228._20_4_ + auVar228._20_4_;
    auVar229._24_4_ = auVar228._24_4_ + auVar228._24_4_;
    fVar104 = auVar228._28_4_;
    auVar229._28_4_ = fVar104 + fVar104;
    auVar231 = ZEXT3264(auVar229);
    auVar248 = vsubps_avx(local_6a0,auVar21);
    auVar11 = ZEXT1632(CONCAT412(fVar251 * fVar251,
                                 CONCAT48(fVar250 * fVar250,
                                          CONCAT44(fVar242 * fVar242,fVar241 * fVar241))));
    auVar228 = vsubps_avx(local_280,auVar11);
    local_6c0._4_4_ = fVar139 * fVar139;
    local_6c0._0_4_ = fVar137 * fVar137;
    fStack_6b8 = auVar229._8_4_ * auVar229._8_4_;
    fStack_6b4 = auVar229._12_4_ * auVar229._12_4_;
    fStack_6b0 = auVar229._16_4_ * auVar229._16_4_;
    fStack_6ac = auVar229._20_4_ * auVar229._20_4_;
    fStack_6a8 = auVar229._24_4_ * auVar229._24_4_;
    fStack_6a4 = fVar104;
    fVar155 = auVar228._0_4_;
    fVar156 = auVar228._4_4_;
    fVar157 = auVar228._8_4_;
    fStack_5b8 = fVar157 * 4.0;
    fVar158 = auVar228._12_4_;
    fStack_5b4 = fVar158 * 4.0;
    fVar241 = auVar228._16_4_;
    fStack_5b0 = fVar241 * 4.0;
    fVar242 = auVar228._20_4_;
    fStack_5ac = fVar242 * 4.0;
    fVar250 = auVar228._24_4_;
    fStack_5a8 = fVar250 * 4.0;
    uStack_5a4 = 0x40800000;
    auVar22._4_4_ = fVar156 * 4.0 * auVar248._4_4_;
    auVar22._0_4_ = fVar155 * 4.0 * auVar248._0_4_;
    auVar22._8_4_ = fStack_5b8 * auVar248._8_4_;
    auVar22._12_4_ = fStack_5b4 * auVar248._12_4_;
    auVar22._16_4_ = fStack_5b0 * auVar248._16_4_;
    auVar22._20_4_ = fStack_5ac * auVar248._20_4_;
    auVar22._24_4_ = fStack_5a8 * auVar248._24_4_;
    auVar22._28_4_ = 0x40800000;
    auVar270 = vsubps_avx(_local_6c0,auVar22);
    auVar97 = vcmpps_avx(auVar270,auVar91,5);
    auVar273 = ZEXT1632(auVar184);
    fVar104 = auVar228._28_4_;
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0x7f,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar97 >> 0xbf,0) == '\0') &&
        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f]) {
      auVar245._8_4_ = 0x7f800000;
      auVar245._0_8_ = 0x7f8000007f800000;
      auVar245._12_4_ = 0x7f800000;
      auVar245._16_4_ = 0x7f800000;
      auVar245._20_4_ = 0x7f800000;
      auVar245._24_4_ = 0x7f800000;
      auVar245._28_4_ = 0x7f800000;
      auVar220._8_4_ = 0xff800000;
      auVar220._0_8_ = 0xff800000ff800000;
      auVar220._12_4_ = 0xff800000;
      auVar220._16_4_ = 0xff800000;
      auVar220._20_4_ = 0xff800000;
      auVar220._24_4_ = 0xff800000;
      auVar220._28_4_ = 0xff800000;
    }
    else {
      auVar6 = vsqrtps_avx(auVar270);
      auVar246._0_4_ = fVar155 + fVar155;
      auVar246._4_4_ = fVar156 + fVar156;
      auVar246._8_4_ = fVar157 + fVar157;
      auVar246._12_4_ = fVar158 + fVar158;
      auVar246._16_4_ = fVar241 + fVar241;
      auVar246._20_4_ = fVar242 + fVar242;
      auVar246._24_4_ = fVar250 + fVar250;
      auVar246._28_4_ = fVar104 + fVar104;
      auVar210 = vrcpps_avx(auVar246);
      auVar91 = vcmpps_avx(auVar270,auVar91,5);
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = &DAT_3f8000003f800000;
      auVar92._12_4_ = 0x3f800000;
      auVar92._16_4_ = 0x3f800000;
      auVar92._20_4_ = 0x3f800000;
      auVar92._24_4_ = 0x3f800000;
      auVar92._28_4_ = 0x3f800000;
      auVar184 = vfnmadd213ps_fma(auVar246,auVar210,auVar92);
      auVar184 = vfmadd132ps_fma(ZEXT1632(auVar184),auVar210,auVar210);
      auVar93._0_8_ = CONCAT44(fVar139,fVar137) ^ 0x8000000080000000;
      auVar93._8_4_ = -auVar229._8_4_;
      auVar93._12_4_ = -auVar229._12_4_;
      auVar93._16_4_ = -auVar229._16_4_;
      auVar93._20_4_ = -auVar229._20_4_;
      auVar93._24_4_ = -auVar229._24_4_;
      auVar93._28_4_ = -auVar229._28_4_;
      auVar270 = vsubps_avx(auVar93,auVar6);
      auVar23._4_4_ = auVar184._4_4_ * auVar270._4_4_;
      auVar23._0_4_ = auVar184._0_4_ * auVar270._0_4_;
      auVar23._8_4_ = auVar184._8_4_ * auVar270._8_4_;
      auVar23._12_4_ = auVar184._12_4_ * auVar270._12_4_;
      auVar23._16_4_ = auVar270._16_4_ * 0.0;
      auVar23._20_4_ = auVar270._20_4_ * 0.0;
      auVar23._24_4_ = auVar270._24_4_ * 0.0;
      auVar23._28_4_ = auVar270._28_4_;
      auVar270 = vsubps_avx(auVar6,auVar229);
      auVar24._4_4_ = auVar184._4_4_ * auVar270._4_4_;
      auVar24._0_4_ = auVar184._0_4_ * auVar270._0_4_;
      auVar24._8_4_ = auVar184._8_4_ * auVar270._8_4_;
      auVar24._12_4_ = auVar184._12_4_ * auVar270._12_4_;
      auVar24._16_4_ = auVar270._16_4_ * 0.0;
      auVar24._20_4_ = auVar270._20_4_ * 0.0;
      auVar24._24_4_ = auVar270._24_4_ * 0.0;
      auVar24._28_4_ = auVar210._28_4_;
      auVar184 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar23,auVar273);
      local_460 = ZEXT1632(CONCAT412(fVar140 * auVar184._12_4_,
                                     CONCAT48(fVar138 * auVar184._8_4_,
                                              CONCAT44(fVar141 * auVar184._4_4_,
                                                       fVar136 * auVar184._0_4_))));
      auVar184 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar24,auVar273);
      local_480 = ZEXT1632(CONCAT412(auVar184._12_4_ * fVar140,
                                     CONCAT48(auVar184._8_4_ * fVar138,
                                              CONCAT44(auVar184._4_4_ * fVar141,
                                                       auVar184._0_4_ * fVar136))));
      auVar209._8_4_ = 0x7f800000;
      auVar209._0_8_ = 0x7f8000007f800000;
      auVar209._12_4_ = 0x7f800000;
      auVar209._16_4_ = 0x7f800000;
      auVar209._20_4_ = 0x7f800000;
      auVar209._24_4_ = 0x7f800000;
      auVar209._28_4_ = 0x7f800000;
      auVar245 = vblendvps_avx(auVar209,auVar23,auVar91);
      auVar54._4_4_ = uStack_75c;
      auVar54._0_4_ = local_760;
      auVar54._8_4_ = uStack_758;
      auVar54._12_4_ = uStack_754;
      auVar54._16_4_ = uStack_750;
      auVar54._20_4_ = uStack_74c;
      auVar54._24_4_ = uStack_748;
      auVar54._28_4_ = uStack_744;
      auVar270 = vandps_avx(auVar11,auVar54);
      auVar270 = vmaxps_avx(local_3a0,auVar270);
      auVar25._4_4_ = auVar270._4_4_ * 1.9073486e-06;
      auVar25._0_4_ = auVar270._0_4_ * 1.9073486e-06;
      auVar25._8_4_ = auVar270._8_4_ * 1.9073486e-06;
      auVar25._12_4_ = auVar270._12_4_ * 1.9073486e-06;
      auVar25._16_4_ = auVar270._16_4_ * 1.9073486e-06;
      auVar25._20_4_ = auVar270._20_4_ * 1.9073486e-06;
      auVar25._24_4_ = auVar270._24_4_ * 1.9073486e-06;
      auVar25._28_4_ = auVar270._28_4_;
      auVar270 = vandps_avx(auVar228,auVar54);
      auVar270 = vcmpps_avx(auVar270,auVar25,1);
      auVar94._8_4_ = 0xff800000;
      auVar94._0_8_ = 0xff800000ff800000;
      auVar94._12_4_ = 0xff800000;
      auVar94._16_4_ = 0xff800000;
      auVar94._20_4_ = 0xff800000;
      auVar94._24_4_ = 0xff800000;
      auVar94._28_4_ = 0xff800000;
      auVar220 = vblendvps_avx(auVar94,auVar24,auVar91);
      auVar210 = auVar91 & auVar270;
      if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar210 >> 0x7f,0) != '\0') ||
            (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar210 >> 0xbf,0) != '\0') ||
          (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar210[0x1f] < '\0') {
        auVar97 = vandps_avx(auVar270,auVar91);
        auVar270 = vcmpps_avx(auVar248,ZEXT832(0) << 0x20,2);
        auVar230._8_4_ = 0xff800000;
        auVar230._0_8_ = 0xff800000ff800000;
        auVar230._12_4_ = 0xff800000;
        auVar230._16_4_ = 0xff800000;
        auVar230._20_4_ = 0xff800000;
        auVar230._24_4_ = 0xff800000;
        auVar230._28_4_ = 0xff800000;
        auVar231 = ZEXT3264(auVar230);
        auVar274._8_4_ = 0x7f800000;
        auVar274._0_8_ = 0x7f8000007f800000;
        auVar274._12_4_ = 0x7f800000;
        auVar274._16_4_ = 0x7f800000;
        auVar274._20_4_ = 0x7f800000;
        auVar274._24_4_ = 0x7f800000;
        auVar274._28_4_ = 0x7f800000;
        auVar248 = vblendvps_avx(auVar274,auVar230,auVar270);
        auVar184 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
        auVar210 = vpmovsxwd_avx2(auVar184);
        auVar245 = vblendvps_avx(auVar245,auVar248,auVar210);
        auVar248 = vblendvps_avx(auVar230,auVar274,auVar270);
        auVar220 = vblendvps_avx(auVar220,auVar248,auVar210);
        auVar100._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
        auVar100._8_4_ = auVar97._8_4_ ^ 0xffffffff;
        auVar100._12_4_ = auVar97._12_4_ ^ 0xffffffff;
        auVar100._16_4_ = auVar97._16_4_ ^ 0xffffffff;
        auVar100._20_4_ = auVar97._20_4_ ^ 0xffffffff;
        auVar100._24_4_ = auVar97._24_4_ ^ 0xffffffff;
        auVar100._28_4_ = auVar97._28_4_ ^ 0xffffffff;
        auVar97 = vorps_avx(auVar270,auVar100);
        auVar97 = vandps_avx(auVar91,auVar97);
      }
    }
    local_9c0 = ZEXT1632(auVar83);
    auVar275 = ZEXT3264(local_2a0);
    auVar248 = local_2a0 & auVar97;
    if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar248 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar248 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar248 >> 0x7f,0) == '\0') &&
          (auVar248 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar248 >> 0xbf,0) == '\0') &&
        (auVar248 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar248[0x1f])
    {
LAB_016e144e:
      auVar249 = ZEXT3264(local_940);
      auVar216 = ZEXT3264(local_960);
    }
    else {
      fVar137 = (ray->org).field_0.m128[3] - (float)local_7b0._0_4_;
      auVar95._4_4_ = fVar137;
      auVar95._0_4_ = fVar137;
      auVar95._8_4_ = fVar137;
      auVar95._12_4_ = fVar137;
      auVar95._16_4_ = fVar137;
      auVar95._20_4_ = fVar137;
      auVar95._24_4_ = fVar137;
      auVar95._28_4_ = fVar137;
      auVar270 = vmaxps_avx(auVar95,auVar245);
      fVar137 = ray->tfar - (float)local_7b0._0_4_;
      auVar203._4_4_ = fVar137;
      auVar203._0_4_ = fVar137;
      auVar203._8_4_ = fVar137;
      auVar203._12_4_ = fVar137;
      auVar203._16_4_ = fVar137;
      auVar203._20_4_ = fVar137;
      auVar203._24_4_ = fVar137;
      auVar203._28_4_ = fVar137;
      auVar188._0_4_ = fVar232 * local_980._0_4_;
      auVar188._4_4_ = fVar235 * local_980._4_4_;
      auVar188._8_4_ = fVar236 * local_980._8_4_;
      auVar188._12_4_ = fVar237 * local_980._12_4_;
      auVar188._16_4_ = fVar239 * local_980._16_4_;
      auVar188._20_4_ = fVar238 * local_980._20_4_;
      auVar188._24_4_ = fVar240 * local_980._24_4_;
      auVar188._28_4_ = 0;
      auVar83 = vfmadd213ps_fma(auVar90,_local_840,auVar188);
      auVar184 = vfmadd213ps_fma(auVar151,local_820,ZEXT1632(auVar83));
      auVar231 = ZEXT3264(CONCAT428(fStack_4a4,
                                    CONCAT424(fStack_4a8,
                                              CONCAT420(fStack_4ac,
                                                        CONCAT416(fStack_4b0,
                                                                  CONCAT412(fStack_4b4,
                                                                            CONCAT48(fStack_4b8,
                                                                                     CONCAT44(
                                                  fStack_4bc,local_4c0))))))));
      auVar26._4_4_ = fStack_4bc * local_980._4_4_;
      auVar26._0_4_ = local_4c0 * local_980._0_4_;
      auVar26._8_4_ = fStack_4b8 * local_980._8_4_;
      auVar26._12_4_ = fStack_4b4 * local_980._12_4_;
      auVar26._16_4_ = fStack_4b0 * local_980._16_4_;
      auVar26._20_4_ = fStack_4ac * local_980._20_4_;
      auVar26._24_4_ = fStack_4a8 * local_980._24_4_;
      auVar26._28_4_ = 0;
      auVar83 = vfmadd231ps_fma(auVar26,_local_700,_local_840);
      auVar234 = vfmadd231ps_fma(ZEXT1632(auVar83),_local_720,local_820);
      auVar55._4_4_ = uStack_75c;
      auVar55._0_4_ = local_760;
      auVar55._8_4_ = uStack_758;
      auVar55._12_4_ = uStack_754;
      auVar55._16_4_ = uStack_750;
      auVar55._20_4_ = uStack_74c;
      auVar55._24_4_ = uStack_748;
      auVar55._28_4_ = uStack_744;
      auVar248 = vandps_avx(auVar55,ZEXT1632(auVar234));
      auVar189._8_4_ = 0x219392ef;
      auVar189._0_8_ = 0x219392ef219392ef;
      auVar189._12_4_ = 0x219392ef;
      auVar189._16_4_ = 0x219392ef;
      auVar189._20_4_ = 0x219392ef;
      auVar189._24_4_ = 0x219392ef;
      auVar189._28_4_ = 0x219392ef;
      auVar90 = vcmpps_avx(auVar248,auVar189,1);
      auVar248 = vrcpps_avx(ZEXT1632(auVar234));
      auVar261._8_4_ = 0x3f800000;
      auVar261._0_8_ = &DAT_3f8000003f800000;
      auVar261._12_4_ = 0x3f800000;
      auVar261._16_4_ = 0x3f800000;
      auVar261._20_4_ = 0x3f800000;
      auVar261._24_4_ = 0x3f800000;
      auVar261._28_4_ = 0x3f800000;
      auVar210 = ZEXT1632(auVar234);
      auVar83 = vfnmadd213ps_fma(auVar248,auVar210,auVar261);
      auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar248,auVar248);
      auVar176._0_8_ = auVar234._0_8_ ^ 0x8000000080000000;
      auVar176._8_4_ = auVar234._8_4_ ^ 0x80000000;
      auVar176._12_4_ = auVar234._12_4_ ^ 0x80000000;
      auVar176._16_4_ = 0x80000000;
      auVar176._20_4_ = 0x80000000;
      auVar176._24_4_ = 0x80000000;
      auVar176._28_4_ = 0x80000000;
      auVar247._0_4_ = auVar83._0_4_ * -auVar184._0_4_;
      auVar247._4_4_ = auVar83._4_4_ * -auVar184._4_4_;
      auVar247._8_4_ = auVar83._8_4_ * -auVar184._8_4_;
      auVar247._12_4_ = auVar83._12_4_ * -auVar184._12_4_;
      auVar247._16_4_ = 0x80000000;
      auVar247._20_4_ = 0x80000000;
      auVar247._24_4_ = 0x80000000;
      auVar247._28_4_ = 0;
      auVar248 = vcmpps_avx(auVar210,auVar176,1);
      auVar248 = vorps_avx(auVar90,auVar248);
      auVar268._8_4_ = 0xff800000;
      auVar268._0_8_ = 0xff800000ff800000;
      auVar268._12_4_ = 0xff800000;
      auVar268._16_4_ = 0xff800000;
      auVar268._20_4_ = 0xff800000;
      auVar268._24_4_ = 0xff800000;
      auVar268._28_4_ = 0xff800000;
      auVar248 = vblendvps_avx(auVar247,auVar268,auVar248);
      auVar91 = vminps_avx(auVar203,auVar220);
      auVar151 = vmaxps_avx(auVar270,auVar248);
      auVar248 = vcmpps_avx(auVar210,auVar176,6);
      auVar248 = vorps_avx(auVar90,auVar248);
      auVar269._8_4_ = 0x7f800000;
      auVar269._0_8_ = 0x7f8000007f800000;
      auVar269._12_4_ = 0x7f800000;
      auVar269._16_4_ = 0x7f800000;
      auVar269._20_4_ = 0x7f800000;
      auVar269._24_4_ = 0x7f800000;
      auVar269._28_4_ = 0x7f800000;
      auVar248 = vblendvps_avx(auVar247,auVar269,auVar248);
      auVar270 = vminps_avx(auVar91,auVar248);
      auVar248 = vsubps_avx(ZEXT832(0) << 0x20,local_7e0);
      auVar90 = vsubps_avx(ZEXT832(0) << 0x20,local_800);
      auVar27._4_4_ = auVar90._4_4_ * fVar224;
      auVar27._0_4_ = auVar90._0_4_ * fVar72;
      auVar27._8_4_ = auVar90._8_4_ * fVar225;
      auVar27._12_4_ = auVar90._12_4_ * fVar226;
      auVar27._16_4_ = auVar90._16_4_ * fVar277;
      auVar27._20_4_ = auVar90._20_4_ * fVar278;
      auVar27._24_4_ = auVar90._24_4_ * fVar279;
      auVar27._28_4_ = auVar90._28_4_;
      auVar83 = vfnmsub231ps_fma(auVar27,local_8e0,auVar248);
      auVar248 = vsubps_avx(ZEXT832(0) << 0x20,auVar9);
      auVar184 = vfnmadd231ps_fma(ZEXT1632(auVar83),local_640,auVar248);
      auVar28._4_4_ = fStack_4bc * fVar224;
      auVar28._0_4_ = local_4c0 * fVar72;
      auVar28._8_4_ = fStack_4b8 * fVar225;
      auVar28._12_4_ = fStack_4b4 * fVar226;
      auVar28._16_4_ = fStack_4b0 * fVar277;
      auVar28._20_4_ = fStack_4ac * fVar278;
      auVar28._24_4_ = fStack_4a8 * fVar279;
      auVar28._28_4_ = auVar248._28_4_;
      auVar83 = vfnmsub231ps_fma(auVar28,local_8e0,_local_700);
      auVar234 = vfnmadd231ps_fma(ZEXT1632(auVar83),local_640,_local_720);
      auVar248 = vandps_avx(auVar55,ZEXT1632(auVar234));
      auVar9 = vrcpps_avx(ZEXT1632(auVar234));
      auVar221._8_4_ = 0x219392ef;
      auVar221._0_8_ = 0x219392ef219392ef;
      auVar221._12_4_ = 0x219392ef;
      auVar221._16_4_ = 0x219392ef;
      auVar221._20_4_ = 0x219392ef;
      auVar221._24_4_ = 0x219392ef;
      auVar221._28_4_ = 0x219392ef;
      auVar90 = vcmpps_avx(auVar248,auVar221,1);
      auVar91 = ZEXT1632(auVar234);
      auVar83 = vfnmadd213ps_fma(auVar9,auVar91,auVar261);
      auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar9,auVar9);
      auVar215._0_8_ = auVar234._0_8_ ^ 0x8000000080000000;
      auVar215._8_4_ = auVar234._8_4_ ^ 0x80000000;
      auVar215._12_4_ = auVar234._12_4_ ^ 0x80000000;
      auVar215._16_4_ = 0x80000000;
      auVar215._20_4_ = 0x80000000;
      auVar215._24_4_ = 0x80000000;
      auVar215._28_4_ = 0x80000000;
      auVar29._4_4_ = auVar83._4_4_ * -auVar184._4_4_;
      auVar29._0_4_ = auVar83._0_4_ * -auVar184._0_4_;
      auVar29._8_4_ = auVar83._8_4_ * -auVar184._8_4_;
      auVar29._12_4_ = auVar83._12_4_ * -auVar184._12_4_;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar248 = vcmpps_avx(auVar91,auVar215,1);
      auVar248 = vorps_avx(auVar248,auVar90);
      auVar222._8_4_ = 0xff800000;
      auVar222._0_8_ = 0xff800000ff800000;
      auVar222._12_4_ = 0xff800000;
      auVar222._16_4_ = 0xff800000;
      auVar222._20_4_ = 0xff800000;
      auVar222._24_4_ = 0xff800000;
      auVar222._28_4_ = 0xff800000;
      auVar248 = vblendvps_avx(auVar29,auVar222,auVar248);
      _local_740 = vmaxps_avx(auVar151,auVar248);
      auVar248 = vcmpps_avx(auVar91,auVar215,6);
      auVar248 = vorps_avx(auVar90,auVar248);
      auVar248 = vblendvps_avx(auVar29,auVar269,auVar248);
      auVar97 = vandps_avx(local_2a0,auVar97);
      local_400 = vminps_avx(auVar270,auVar248);
      auVar248 = vcmpps_avx(_local_740,local_400,2);
      auVar90 = auVar97 & auVar248;
      if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar90 >> 0x7f,0) == '\0') &&
            (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar90 >> 0xbf,0) == '\0') &&
          (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar90[0x1f])
      goto LAB_016e144e;
      auVar211._8_4_ = 0x3f800000;
      auVar211._0_8_ = &DAT_3f8000003f800000;
      auVar211._12_4_ = 0x3f800000;
      auVar211._16_4_ = 0x3f800000;
      auVar211._20_4_ = 0x3f800000;
      auVar211._24_4_ = 0x3f800000;
      auVar211._28_4_ = 0x3f800000;
      auVar90 = vminps_avx(local_460,auVar211);
      auVar270 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar90 = vmaxps_avx(auVar90,auVar270);
      auVar151 = vminps_avx(local_480,auVar211);
      auVar151 = vmaxps_avx(auVar151,auVar270);
      auVar31._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar31._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar31._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar31._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar31._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar31._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar31._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar31._28_4_ = auVar90._28_4_ + 7.0;
      auVar83 = vfmadd213ps_fma(auVar31,auVar87,local_660);
      auVar32._4_4_ = (auVar151._4_4_ + 1.0) * 0.125;
      auVar32._0_4_ = (auVar151._0_4_ + 0.0) * 0.125;
      auVar32._8_4_ = (auVar151._8_4_ + 2.0) * 0.125;
      auVar32._12_4_ = (auVar151._12_4_ + 3.0) * 0.125;
      auVar32._16_4_ = (auVar151._16_4_ + 4.0) * 0.125;
      auVar32._20_4_ = (auVar151._20_4_ + 5.0) * 0.125;
      auVar32._24_4_ = (auVar151._24_4_ + 6.0) * 0.125;
      auVar32._28_4_ = auVar151._28_4_ + 7.0;
      auVar184 = vfmadd213ps_fma(auVar32,auVar87,local_660);
      auVar90 = vminps_avx(local_8a0,local_8c0);
      auVar151 = vminps_avx(local_880,local_680);
      auVar90 = vminps_avx(auVar90,auVar151);
      auVar90 = vsubps_avx(auVar90,auVar7);
      auVar97 = vandps_avx(auVar248,auVar97);
      local_460 = ZEXT1632(auVar83);
      local_480 = ZEXT1632(auVar184);
      auVar33._4_4_ = auVar90._4_4_ * 0.99999976;
      auVar33._0_4_ = auVar90._0_4_ * 0.99999976;
      auVar33._8_4_ = auVar90._8_4_ * 0.99999976;
      auVar33._12_4_ = auVar90._12_4_ * 0.99999976;
      auVar33._16_4_ = auVar90._16_4_ * 0.99999976;
      auVar33._20_4_ = auVar90._20_4_ * 0.99999976;
      auVar33._24_4_ = auVar90._24_4_ * 0.99999976;
      auVar33._28_4_ = 0x3f7ffffc;
      auVar248 = vmaxps_avx(ZEXT832(0) << 0x20,auVar33);
      auVar34._4_4_ = auVar248._4_4_ * auVar248._4_4_;
      auVar34._0_4_ = auVar248._0_4_ * auVar248._0_4_;
      auVar34._8_4_ = auVar248._8_4_ * auVar248._8_4_;
      auVar34._12_4_ = auVar248._12_4_ * auVar248._12_4_;
      auVar34._16_4_ = auVar248._16_4_ * auVar248._16_4_;
      auVar34._20_4_ = auVar248._20_4_ * auVar248._20_4_;
      auVar34._24_4_ = auVar248._24_4_ * auVar248._24_4_;
      auVar34._28_4_ = auVar248._28_4_;
      auVar90 = vsubps_avx(local_6a0,auVar34);
      auVar35._4_4_ = auVar90._4_4_ * fVar156 * 4.0;
      auVar35._0_4_ = auVar90._0_4_ * fVar155 * 4.0;
      auVar35._8_4_ = auVar90._8_4_ * fStack_5b8;
      auVar35._12_4_ = auVar90._12_4_ * fStack_5b4;
      auVar35._16_4_ = auVar90._16_4_ * fStack_5b0;
      auVar35._20_4_ = auVar90._20_4_ * fStack_5ac;
      auVar35._24_4_ = auVar90._24_4_ * fStack_5a8;
      auVar35._28_4_ = auVar248._28_4_;
      auVar248 = vsubps_avx(_local_6c0,auVar35);
      local_ae0 = vcmpps_avx(auVar248,ZEXT1232(ZEXT812(0)) << 0x20,5);
      if ((((((((local_ae0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_ae0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_ae0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_ae0 >> 0x7f,0) == '\0') &&
            (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_ae0 >> 0xbf,0) == '\0') &&
          (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_ae0[0x1f]) {
        auVar149 = SUB6432(ZEXT864(0),0) << 0x20;
        local_600 = ZEXT832(0) << 0x20;
        _local_620 = ZEXT832(0) << 0x20;
        auVar178 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_ac0 = ZEXT832(0) << 0x20;
        auVar204._8_4_ = 0x7f800000;
        auVar204._0_8_ = 0x7f8000007f800000;
        auVar204._12_4_ = 0x7f800000;
        auVar204._16_4_ = 0x7f800000;
        auVar204._20_4_ = 0x7f800000;
        auVar204._24_4_ = 0x7f800000;
        auVar204._28_4_ = 0x7f800000;
        auVar212._8_4_ = 0xff800000;
        auVar212._0_8_ = 0xff800000ff800000;
        auVar212._12_4_ = 0xff800000;
        auVar212._16_4_ = 0xff800000;
        auVar212._20_4_ = 0xff800000;
        auVar212._24_4_ = 0xff800000;
        auVar212._28_4_ = 0xff800000;
        local_5e0 = local_600;
      }
      else {
        auVar150._0_4_ = fVar155 + fVar155;
        auVar150._4_4_ = fVar156 + fVar156;
        auVar150._8_4_ = fVar157 + fVar157;
        auVar150._12_4_ = fVar158 + fVar158;
        auVar150._16_4_ = fVar241 + fVar241;
        auVar150._20_4_ = fVar242 + fVar242;
        auVar150._24_4_ = fVar250 + fVar250;
        auVar150._28_4_ = fVar104 + fVar104;
        auVar151 = vrcpps_avx(auVar150);
        auVar205._8_4_ = 0x3f800000;
        auVar205._0_8_ = &DAT_3f8000003f800000;
        auVar205._12_4_ = 0x3f800000;
        auVar205._16_4_ = 0x3f800000;
        auVar205._20_4_ = 0x3f800000;
        auVar205._24_4_ = 0x3f800000;
        auVar205._28_4_ = 0x3f800000;
        auVar83 = vfnmadd213ps_fma(auVar150,auVar151,auVar205);
        auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar151,auVar151);
        auVar151 = vsqrtps_avx(auVar248);
        auVar190._0_8_ = auVar229._0_8_ ^ 0x8000000080000000;
        auVar190._8_4_ = -auVar229._8_4_;
        auVar190._12_4_ = -auVar229._12_4_;
        auVar190._16_4_ = -auVar229._16_4_;
        auVar190._20_4_ = -auVar229._20_4_;
        auVar190._24_4_ = -auVar229._24_4_;
        auVar190._28_4_ = -auVar229._28_4_;
        auVar270 = vsubps_avx(auVar190,auVar151);
        auVar151 = vsubps_avx(auVar151,auVar229);
        fVar155 = auVar270._0_4_ * auVar83._0_4_;
        fVar277 = auVar270._4_4_ * auVar83._4_4_;
        auVar36._4_4_ = fVar277;
        auVar36._0_4_ = fVar155;
        fVar278 = auVar270._8_4_ * auVar83._8_4_;
        auVar36._8_4_ = fVar278;
        fVar279 = auVar270._12_4_ * auVar83._12_4_;
        auVar36._12_4_ = fVar279;
        fVar156 = auVar270._16_4_ * 0.0;
        auVar36._16_4_ = fVar156;
        fVar157 = auVar270._20_4_ * 0.0;
        auVar36._20_4_ = fVar157;
        fVar158 = auVar270._24_4_ * 0.0;
        auVar36._24_4_ = fVar158;
        auVar36._28_4_ = local_2a0._28_4_;
        auVar275 = ZEXT3264(auVar36);
        fVar104 = auVar151._0_4_ * auVar83._0_4_;
        fVar72 = auVar151._4_4_ * auVar83._4_4_;
        auVar37._4_4_ = fVar72;
        auVar37._0_4_ = fVar104;
        fVar224 = auVar151._8_4_ * auVar83._8_4_;
        auVar37._8_4_ = fVar224;
        fVar137 = auVar151._12_4_ * auVar83._12_4_;
        auVar37._12_4_ = fVar137;
        fVar225 = auVar151._16_4_ * 0.0;
        auVar37._16_4_ = fVar225;
        fVar139 = auVar151._20_4_ * 0.0;
        auVar37._20_4_ = fVar139;
        fVar226 = auVar151._24_4_ * 0.0;
        auVar37._24_4_ = fVar226;
        auVar37._28_4_ = 0xff800000;
        auVar83 = vfmadd213ps_fma(local_9c0,auVar36,auVar273);
        auVar184 = vfmadd213ps_fma(local_9c0,auVar37,auVar273);
        auVar38._28_4_ = auVar270._28_4_;
        auVar38._0_28_ =
             ZEXT1628(CONCAT412(fVar140 * auVar83._12_4_,
                                CONCAT48(fVar138 * auVar83._8_4_,
                                         CONCAT44(fVar141 * auVar83._4_4_,fVar136 * auVar83._0_4_)))
                     );
        auVar151 = ZEXT1632(CONCAT412(fVar140 * auVar184._12_4_,
                                      CONCAT48(fVar138 * auVar184._8_4_,
                                               CONCAT44(fVar141 * auVar184._4_4_,
                                                        fVar136 * auVar184._0_4_))));
        auVar83 = vfmadd213ps_fma(auVar8,auVar38,local_a80);
        auVar184 = vfmadd213ps_fma(auVar8,auVar151,local_a80);
        auVar234 = vfmadd213ps_fma(auVar178,auVar38,auVar88);
        auVar114 = vfmadd213ps_fma(auVar178,auVar151,auVar88);
        auVar123 = vfmadd213ps_fma(auVar38,auVar149,auVar271);
        auVar144 = vfmadd213ps_fma(auVar149,auVar151,auVar271);
        auVar39._4_4_ = fVar277 * (float)local_720._4_4_;
        auVar39._0_4_ = fVar155 * (float)local_720._0_4_;
        auVar39._8_4_ = fVar278 * fStack_718;
        auVar39._12_4_ = fVar279 * fStack_714;
        auVar39._16_4_ = fVar156 * fStack_710;
        auVar39._20_4_ = fVar157 * fStack_70c;
        auVar39._24_4_ = fVar158 * fStack_708;
        auVar39._28_4_ = 0;
        auVar149 = vsubps_avx(auVar39,ZEXT1632(auVar83));
        auVar179._0_4_ = fVar155 * (float)local_700._0_4_;
        auVar179._4_4_ = fVar277 * (float)local_700._4_4_;
        auVar179._8_4_ = fVar278 * fStack_6f8;
        auVar179._12_4_ = fVar279 * fStack_6f4;
        auVar179._16_4_ = fVar156 * fStack_6f0;
        auVar179._20_4_ = fVar157 * fStack_6ec;
        auVar179._24_4_ = fVar158 * fStack_6e8;
        auVar179._28_4_ = 0;
        auVar178 = vsubps_avx(auVar179,ZEXT1632(auVar234));
        auVar206._0_4_ = local_4c0 * fVar155;
        auVar206._4_4_ = fStack_4bc * fVar277;
        auVar206._8_4_ = fStack_4b8 * fVar278;
        auVar206._12_4_ = fStack_4b4 * fVar279;
        auVar206._16_4_ = fStack_4b0 * fVar156;
        auVar206._20_4_ = fStack_4ac * fVar157;
        auVar206._24_4_ = fStack_4a8 * fVar158;
        auVar206._28_4_ = 0;
        _local_ac0 = vsubps_avx(auVar206,ZEXT1632(auVar123));
        auVar40._4_4_ = fVar72 * (float)local_720._4_4_;
        auVar40._0_4_ = fVar104 * (float)local_720._0_4_;
        auVar40._8_4_ = fVar224 * fStack_718;
        auVar40._12_4_ = fVar137 * fStack_714;
        auVar40._16_4_ = fVar225 * fStack_710;
        auVar40._20_4_ = fVar139 * fStack_70c;
        auVar40._24_4_ = fVar226 * fStack_708;
        auVar40._28_4_ = 0;
        local_5e0 = vsubps_avx(auVar40,ZEXT1632(auVar184));
        auVar41._4_4_ = fVar72 * (float)local_700._4_4_;
        auVar41._0_4_ = fVar104 * (float)local_700._0_4_;
        auVar41._8_4_ = fVar224 * fStack_6f8;
        auVar41._12_4_ = fVar137 * fStack_6f4;
        auVar41._16_4_ = fVar225 * fStack_6f0;
        auVar41._20_4_ = fVar139 * fStack_6ec;
        auVar41._24_4_ = fVar226 * fStack_6e8;
        auVar41._28_4_ = local_5e0._28_4_;
        local_600 = vsubps_avx(auVar41,ZEXT1632(auVar114));
        auVar42._4_4_ = fStack_4bc * fVar72;
        auVar42._0_4_ = local_4c0 * fVar104;
        auVar42._8_4_ = fStack_4b8 * fVar224;
        auVar42._12_4_ = fStack_4b4 * fVar137;
        auVar42._16_4_ = fStack_4b0 * fVar225;
        auVar42._20_4_ = fStack_4ac * fVar139;
        auVar42._24_4_ = fStack_4a8 * fVar226;
        auVar42._28_4_ = local_600._28_4_;
        _local_620 = vsubps_avx(auVar42,ZEXT1632(auVar144));
        auVar8 = vcmpps_avx(auVar248,_DAT_02020f00,5);
        auVar207._8_4_ = 0x7f800000;
        auVar207._0_8_ = 0x7f8000007f800000;
        auVar207._12_4_ = 0x7f800000;
        auVar207._16_4_ = 0x7f800000;
        auVar207._20_4_ = 0x7f800000;
        auVar207._24_4_ = 0x7f800000;
        auVar207._28_4_ = 0x7f800000;
        auVar204 = vblendvps_avx(auVar207,auVar36,auVar8);
        auVar56._4_4_ = uStack_75c;
        auVar56._0_4_ = local_760;
        auVar56._8_4_ = uStack_758;
        auVar56._12_4_ = uStack_754;
        auVar56._16_4_ = uStack_750;
        auVar56._20_4_ = uStack_74c;
        auVar56._24_4_ = uStack_748;
        auVar56._28_4_ = uStack_744;
        auVar248 = vandps_avx(auVar56,auVar11);
        auVar248 = vmaxps_avx(local_3a0,auVar248);
        auVar43._4_4_ = auVar248._4_4_ * 1.9073486e-06;
        auVar43._0_4_ = auVar248._0_4_ * 1.9073486e-06;
        auVar43._8_4_ = auVar248._8_4_ * 1.9073486e-06;
        auVar43._12_4_ = auVar248._12_4_ * 1.9073486e-06;
        auVar43._16_4_ = auVar248._16_4_ * 1.9073486e-06;
        auVar43._20_4_ = auVar248._20_4_ * 1.9073486e-06;
        auVar43._24_4_ = auVar248._24_4_ * 1.9073486e-06;
        auVar43._28_4_ = auVar248._28_4_;
        auVar248 = vandps_avx(auVar56,auVar228);
        auVar248 = vcmpps_avx(auVar248,auVar43,1);
        auVar231 = ZEXT3264(auVar248);
        auVar213._8_4_ = 0xff800000;
        auVar213._0_8_ = 0xff800000ff800000;
        auVar213._12_4_ = 0xff800000;
        auVar213._16_4_ = 0xff800000;
        auVar213._20_4_ = 0xff800000;
        auVar213._24_4_ = 0xff800000;
        auVar213._28_4_ = 0xff800000;
        auVar212 = vblendvps_avx(auVar213,auVar37,auVar8);
        auVar228 = auVar8 & auVar248;
        if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar228 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar228 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar228 >> 0x7f,0) != '\0') ||
              (auVar228 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar228 >> 0xbf,0) != '\0') ||
            (auVar228 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar228[0x1f] < '\0') {
          auVar248 = vandps_avx(auVar248,auVar8);
          auVar90 = vcmpps_avx(auVar90,ZEXT832(0) << 0x20,2);
          auVar257._8_4_ = 0xff800000;
          auVar257._0_8_ = 0xff800000ff800000;
          auVar257._12_4_ = 0xff800000;
          auVar257._16_4_ = 0xff800000;
          auVar257._20_4_ = 0xff800000;
          auVar257._24_4_ = 0xff800000;
          auVar257._28_4_ = 0xff800000;
          auVar263._8_4_ = 0x7f800000;
          auVar263._0_8_ = 0x7f8000007f800000;
          auVar263._12_4_ = 0x7f800000;
          auVar263._16_4_ = 0x7f800000;
          auVar263._20_4_ = 0x7f800000;
          auVar263._24_4_ = 0x7f800000;
          auVar263._28_4_ = 0x7f800000;
          auVar228 = vblendvps_avx(auVar263,auVar257,auVar90);
          auVar83 = vpackssdw_avx(auVar248._0_16_,auVar248._16_16_);
          auVar151 = vpmovsxwd_avx2(auVar83);
          auVar231 = ZEXT3264(auVar151);
          auVar204 = vblendvps_avx(auVar204,auVar228,auVar151);
          auVar228 = vblendvps_avx(auVar257,auVar263,auVar90);
          auVar212 = vblendvps_avx(auVar212,auVar228,auVar151);
          auVar223._0_8_ = auVar248._0_8_ ^ 0xffffffffffffffff;
          auVar223._8_4_ = auVar248._8_4_ ^ 0xffffffff;
          auVar223._12_4_ = auVar248._12_4_ ^ 0xffffffff;
          auVar223._16_4_ = auVar248._16_4_ ^ 0xffffffff;
          auVar223._20_4_ = auVar248._20_4_ ^ 0xffffffff;
          auVar223._24_4_ = auVar248._24_4_ ^ 0xffffffff;
          auVar223._28_4_ = auVar248._28_4_ ^ 0xffffffff;
          auVar248 = vorps_avx(auVar90,auVar223);
          local_ae0 = vandps_avx(auVar248,auVar8);
        }
      }
      uVar71 = *(undefined4 *)&(ray->dir).field_0;
      auVar262._4_4_ = uVar71;
      auVar262._0_4_ = uVar71;
      auVar262._8_4_ = uVar71;
      auVar262._12_4_ = uVar71;
      auVar262._16_4_ = uVar71;
      auVar262._20_4_ = uVar71;
      auVar262._24_4_ = uVar71;
      auVar262._28_4_ = uVar71;
      uVar71 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar256._4_4_ = uVar71;
      auVar256._0_4_ = uVar71;
      auVar256._8_4_ = uVar71;
      auVar256._12_4_ = uVar71;
      auVar256._16_4_ = uVar71;
      auVar256._20_4_ = uVar71;
      auVar256._24_4_ = uVar71;
      auVar256._28_4_ = uVar71;
      local_9a0._4_4_ = (ray->dir).field_0.m128[2];
      local_3e0 = _local_740;
      local_3c0 = vminps_avx(local_400,auVar204);
      _local_520 = vmaxps_avx(_local_740,auVar212);
      _local_420 = _local_520;
      auVar248 = vcmpps_avx(_local_740,local_3c0,2);
      local_4e0 = vandps_avx(auVar248,auVar97);
      auVar248 = vcmpps_avx(_local_520,local_400,2);
      local_5a0 = vandps_avx(auVar248,auVar97);
      auVar97 = vorps_avx(local_5a0,local_4e0);
      auVar249 = ZEXT3264(local_940);
      auVar216 = ZEXT3264(local_960);
      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0x7f,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar97 >> 0xbf,0) != '\0') ||
          (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar97[0x1f] < '\0') {
        local_560._0_8_ = local_ae0._0_8_ ^ 0xffffffffffffffff;
        local_560._8_4_ = local_ae0._8_4_ ^ 0xffffffff;
        local_560._12_4_ = local_ae0._12_4_ ^ 0xffffffff;
        local_560._16_4_ = local_ae0._16_4_ ^ 0xffffffff;
        local_560._20_4_ = local_ae0._20_4_ ^ 0xffffffff;
        local_560._24_4_ = local_ae0._24_4_ ^ 0xffffffff;
        local_560._28_4_ = local_ae0._28_4_ ^ 0xffffffff;
        local_9a0._0_4_ = local_9a0._4_4_;
        fStack_998 = (float)local_9a0._4_4_;
        fStack_994 = (float)local_9a0._4_4_;
        fStack_990 = (float)local_9a0._4_4_;
        fStack_98c = (float)local_9a0._4_4_;
        fStack_988 = (float)local_9a0._4_4_;
        fStack_984 = (float)local_9a0._4_4_;
        auVar44._4_4_ = (float)local_9a0._4_4_ * (float)local_ac0._4_4_;
        auVar44._0_4_ = (float)local_9a0._4_4_ * (float)local_ac0._0_4_;
        auVar44._8_4_ = (float)local_9a0._4_4_ * fStack_ab8;
        auVar44._12_4_ = (float)local_9a0._4_4_ * fStack_ab4;
        auVar44._16_4_ = (float)local_9a0._4_4_ * fStack_ab0;
        auVar44._20_4_ = (float)local_9a0._4_4_ * fStack_aac;
        auVar44._24_4_ = (float)local_9a0._4_4_ * fStack_aa8;
        auVar44._28_4_ = local_ae0._28_4_;
        auVar83 = vfmadd213ps_fma(auVar178,auVar256,auVar44);
        auVar83 = vfmadd213ps_fma(auVar149,auVar262,ZEXT1632(auVar83));
        auVar57._4_4_ = uStack_75c;
        auVar57._0_4_ = local_760;
        auVar57._8_4_ = uStack_758;
        auVar57._12_4_ = uStack_754;
        auVar57._16_4_ = uStack_750;
        auVar57._20_4_ = uStack_74c;
        auVar57._24_4_ = uStack_748;
        auVar57._28_4_ = uStack_744;
        auVar97 = vandps_avx(ZEXT1632(auVar83),auVar57);
        auVar128._8_4_ = 0x3e99999a;
        auVar128._0_8_ = 0x3e99999a3e99999a;
        auVar128._12_4_ = 0x3e99999a;
        auVar128._16_4_ = 0x3e99999a;
        auVar128._20_4_ = 0x3e99999a;
        auVar128._24_4_ = 0x3e99999a;
        auVar128._28_4_ = 0x3e99999a;
        auVar97 = vcmpps_avx(auVar97,auVar128,1);
        auVar97 = vorps_avx(auVar97,local_560);
        auVar129._8_4_ = 3;
        auVar129._0_8_ = 0x300000003;
        auVar129._12_4_ = 3;
        auVar129._16_4_ = 3;
        auVar129._20_4_ = 3;
        auVar129._24_4_ = 3;
        auVar129._28_4_ = 3;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar97 = vblendvps_avx(auVar152,auVar129,auVar97);
        uVar71 = (undefined4)local_5c0;
        local_340._4_4_ = uVar71;
        local_340._0_4_ = uVar71;
        local_340._8_4_ = uVar71;
        local_340._12_4_ = uVar71;
        local_340._16_4_ = uVar71;
        local_340._20_4_ = uVar71;
        local_340._24_4_ = uVar71;
        local_340._28_4_ = uVar71;
        local_500 = vpcmpgtd_avx2(auVar97,local_340);
        local_580 = vpandn_avx2(local_500,local_4e0);
        auVar101 = ZEXT3264(local_580);
        auVar97 = local_4e0 & ~local_500;
        auVar201 = _local_9a0;
        local_540 = local_5a0;
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0xbf,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar97[0x1f] < '\0') {
          auVar184 = vminps_avx(local_a00,local_a20);
          auVar83 = vmaxps_avx(local_a00,local_a20);
          auVar234 = vminps_avx(local_a10,_local_a30);
          auVar114 = vminps_avx(auVar184,auVar234);
          auVar184 = vmaxps_avx(local_a10,_local_a30);
          auVar234 = vmaxps_avx(auVar83,auVar184);
          auVar83 = vandps_avx(auVar114,local_a40);
          auVar184 = vandps_avx(auVar234,local_a40);
          auVar83 = vmaxps_avx(auVar83,auVar184);
          auVar184 = vmovshdup_avx(auVar83);
          auVar184 = vmaxss_avx(auVar184,auVar83);
          auVar83 = vshufpd_avx(auVar83,auVar83,1);
          auVar83 = vmaxss_avx(auVar83,auVar184);
          local_820._4_24_ = auVar208._4_24_;
          local_820._0_4_ = auVar83._0_4_ * 1.9073486e-06;
          local_820._28_4_ = 0;
          local_6e0._0_16_ = vshufps_avx(auVar234,auVar234,0xff);
          local_6e0._16_16_ = auVar7._16_16_;
          local_780._4_4_ = (float)local_740._4_4_ + (float)local_860._4_4_;
          local_780._0_4_ = (float)local_740._0_4_ + (float)local_860._0_4_;
          fStack_778 = fStack_738 + fStack_858;
          fStack_774 = fStack_734 + fStack_854;
          fStack_770 = fStack_730 + fStack_850;
          fStack_76c = fStack_72c + fStack_84c;
          fStack_768 = fStack_728 + fStack_848;
          fStack_764 = fStack_724 + fStack_844;
          local_8c0 = auVar256;
          local_8a0 = auVar262;
          do {
            auVar130._8_4_ = 0x7f800000;
            auVar130._0_8_ = 0x7f8000007f800000;
            auVar130._12_4_ = 0x7f800000;
            auVar130._16_4_ = 0x7f800000;
            auVar130._20_4_ = 0x7f800000;
            auVar130._24_4_ = 0x7f800000;
            auVar130._28_4_ = 0x7f800000;
            auVar97 = auVar101._0_32_;
            auVar248 = vblendvps_avx(auVar130,_local_740,auVar97);
            auVar7 = vshufps_avx(auVar248,auVar248,0xb1);
            auVar7 = vminps_avx(auVar248,auVar7);
            auVar228 = vshufpd_avx(auVar7,auVar7,5);
            auVar7 = vminps_avx(auVar7,auVar228);
            auVar228 = vpermpd_avx2(auVar7,0x4e);
            auVar7 = vminps_avx(auVar7,auVar228);
            auVar248 = vcmpps_avx(auVar248,auVar7,0);
            auVar7 = auVar97 & auVar248;
            if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar7 >> 0x7f,0) != '\0') ||
                  (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar7 >> 0xbf,0) != '\0') ||
                (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar7[0x1f] < '\0') {
              auVar97 = vandps_avx(auVar248,auVar97);
            }
            uVar65 = vmovmskps_avx(auVar97);
            iVar10 = 0;
            for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
              iVar10 = iVar10 + 1;
            }
            uVar65 = iVar10 << 2;
            *(undefined4 *)(local_580 + uVar65) = 0;
            aVar1 = (ray->dir).field_0;
            local_800._0_16_ = (undefined1  [16])aVar1;
            auVar83 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            local_a80._0_16_ = ZEXT416(*(uint *)(local_460 + uVar65));
            _local_ac0 = ZEXT416(*(uint *)(local_3e0 + uVar65));
            if (auVar83._0_4_ < 0.0) {
              auVar275 = ZEXT1664(auVar275._0_16_);
              fVar104 = sqrtf(auVar83._0_4_);
            }
            else {
              auVar83 = vsqrtss_avx(auVar83,auVar83);
              fVar104 = auVar83._0_4_;
            }
            local_660._0_4_ = fVar104 * 1.9073486e-06;
            lVar68 = 5;
            do {
              fVar72 = local_a80._0_4_;
              fVar104 = 1.0 - fVar72;
              auVar108._0_4_ = local_a20._0_4_ * fVar72;
              auVar108._4_4_ = local_a20._4_4_ * fVar72;
              auVar108._8_4_ = local_a20._8_4_ * fVar72;
              auVar108._12_4_ = local_a20._12_4_ * fVar72;
              auVar143._4_4_ = fVar104;
              auVar143._0_4_ = fVar104;
              auVar143._8_4_ = fVar104;
              auVar143._12_4_ = fVar104;
              auVar83 = vfmadd231ps_fma(auVar108,auVar143,local_a00);
              auVar160._0_4_ = local_a10._0_4_ * fVar72;
              auVar160._4_4_ = local_a10._4_4_ * fVar72;
              auVar160._8_4_ = local_a10._8_4_ * fVar72;
              auVar160._12_4_ = local_a10._12_4_ * fVar72;
              auVar184 = vfmadd231ps_fma(auVar160,auVar143,local_a20);
              auVar197._0_4_ = fVar72 * auVar184._0_4_;
              auVar197._4_4_ = fVar72 * auVar184._4_4_;
              auVar197._8_4_ = fVar72 * auVar184._8_4_;
              auVar197._12_4_ = fVar72 * auVar184._12_4_;
              local_980._0_16_ = vfmadd231ps_fma(auVar197,auVar143,auVar83);
              auVar109._0_4_ = fVar72 * (float)local_a30._0_4_;
              auVar109._4_4_ = fVar72 * (float)local_a30._4_4_;
              auVar109._8_4_ = fVar72 * fStack_a28;
              auVar109._12_4_ = fVar72 * fStack_a24;
              auVar83 = vfmadd231ps_fma(auVar109,auVar143,local_a10);
              auVar183._0_4_ = fVar72 * auVar83._0_4_;
              auVar183._4_4_ = fVar72 * auVar83._4_4_;
              auVar183._8_4_ = fVar72 * auVar83._8_4_;
              auVar183._12_4_ = fVar72 * auVar83._12_4_;
              auVar184 = vfmadd231ps_fma(auVar183,auVar143,auVar184);
              auVar110._4_4_ = local_ac0._0_4_;
              auVar110._0_4_ = local_ac0._0_4_;
              auVar110._8_4_ = local_ac0._0_4_;
              auVar110._12_4_ = local_ac0._0_4_;
              auVar83 = vfmadd213ps_fma(auVar110,local_800._0_16_,_DAT_01feba10);
              auVar79._0_4_ = fVar72 * auVar184._0_4_;
              auVar79._4_4_ = fVar72 * auVar184._4_4_;
              auVar79._8_4_ = fVar72 * auVar184._8_4_;
              auVar79._12_4_ = fVar72 * auVar184._12_4_;
              auVar234 = vfmadd231ps_fma(auVar79,local_980._0_16_,auVar143);
              local_640._0_16_ = auVar234;
              auVar83 = vsubps_avx(auVar83,auVar234);
              _local_840 = auVar83;
              auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
              local_7e0._0_16_ = auVar83;
              if (auVar83._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar104);
                local_a60._0_16_ = auVar184;
                auVar275 = ZEXT1664(auVar275._0_16_);
                auVar216._0_4_ = sqrtf(auVar83._0_4_);
                auVar216._4_60_ = extraout_var;
                auVar83 = auVar216._0_16_;
                auVar184 = local_a60._0_16_;
                auVar234 = local_ae0._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                auVar234 = ZEXT416((uint)fVar104);
              }
              auVar231 = ZEXT1664(auVar83);
              auVar184 = vsubps_avx(auVar184,local_980._0_16_);
              local_980._0_4_ = auVar184._0_4_ * 3.0;
              local_980._4_4_ = auVar184._4_4_ * 3.0;
              local_980._8_4_ = auVar184._8_4_ * 3.0;
              local_980._12_4_ = auVar184._12_4_ * 3.0;
              auVar184 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar234,local_a80._0_16_);
              auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar234);
              fVar104 = auVar234._0_4_ * 6.0;
              fVar72 = auVar184._0_4_ * 6.0;
              fVar136 = auVar114._0_4_ * 6.0;
              fVar224 = local_a80._0_4_ * 6.0;
              auVar161._0_4_ = fVar224 * (float)local_a30._0_4_;
              auVar161._4_4_ = fVar224 * (float)local_a30._4_4_;
              auVar161._8_4_ = fVar224 * fStack_a28;
              auVar161._12_4_ = fVar224 * fStack_a24;
              auVar111._4_4_ = fVar136;
              auVar111._0_4_ = fVar136;
              auVar111._8_4_ = fVar136;
              auVar111._12_4_ = fVar136;
              auVar184 = vfmadd132ps_fma(auVar111,auVar161,local_a10);
              auVar162._4_4_ = fVar72;
              auVar162._0_4_ = fVar72;
              auVar162._8_4_ = fVar72;
              auVar162._12_4_ = fVar72;
              auVar184 = vfmadd132ps_fma(auVar162,auVar184,local_a20);
              auVar234 = vdpps_avx(local_980._0_16_,local_980._0_16_,0x7f);
              auVar112._4_4_ = fVar104;
              auVar112._0_4_ = fVar104;
              auVar112._8_4_ = fVar104;
              auVar112._12_4_ = fVar104;
              auVar123 = vfmadd132ps_fma(auVar112,auVar184,local_a00);
              auVar184 = vblendps_avx(auVar234,_DAT_01feba10,0xe);
              auVar114 = vrsqrtss_avx(auVar184,auVar184);
              fVar136 = auVar234._0_4_;
              fVar104 = auVar114._0_4_;
              auVar114 = vdpps_avx(local_980._0_16_,auVar123,0x7f);
              fVar104 = fVar104 * 1.5 + fVar136 * -0.5 * fVar104 * fVar104 * fVar104;
              auVar113._0_4_ = auVar123._0_4_ * fVar136;
              auVar113._4_4_ = auVar123._4_4_ * fVar136;
              auVar113._8_4_ = auVar123._8_4_ * fVar136;
              auVar113._12_4_ = auVar123._12_4_ * fVar136;
              fVar72 = auVar114._0_4_;
              auVar198._0_4_ = local_980._0_4_ * fVar72;
              auVar198._4_4_ = local_980._4_4_ * fVar72;
              auVar198._8_4_ = local_980._8_4_ * fVar72;
              auVar198._12_4_ = local_980._12_4_ * fVar72;
              auVar114 = vsubps_avx(auVar113,auVar198);
              auVar184 = vrcpss_avx(auVar184,auVar184);
              auVar123 = vfnmadd213ss_fma(auVar184,auVar234,ZEXT416(0x40000000));
              fVar72 = auVar184._0_4_ * auVar123._0_4_;
              auVar184 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                    ZEXT416((uint)((float)local_ac0._0_4_ * (float)local_660._0_4_))
                                   );
              local_ae0._0_4_ = auVar184._0_4_;
              uVar70 = CONCAT44(local_980._4_4_,local_980._0_4_);
              auVar244._0_8_ = uVar70 ^ 0x8000000080000000;
              auVar244._8_4_ = -local_980._8_4_;
              auVar244._12_4_ = -local_980._12_4_;
              auVar163._0_4_ = fVar104 * auVar114._0_4_ * fVar72;
              auVar163._4_4_ = fVar104 * auVar114._4_4_ * fVar72;
              auVar163._8_4_ = fVar104 * auVar114._8_4_ * fVar72;
              auVar163._12_4_ = fVar104 * auVar114._12_4_ * fVar72;
              local_9c0._0_4_ = local_980._0_4_ * fVar104;
              local_9c0._4_4_ = local_980._4_4_ * fVar104;
              local_9c0._8_4_ = local_980._8_4_ * fVar104;
              local_9c0._12_4_ = local_980._12_4_ * fVar104;
              if (fVar136 < -fVar136) {
                local_a60._0_4_ = auVar83._0_4_;
                local_8e0._0_16_ = auVar244;
                local_880._0_16_ = auVar163;
                auVar275 = ZEXT1664(auVar275._0_16_);
                fVar104 = sqrtf(fVar136);
                auVar231 = ZEXT464((uint)local_a60._0_4_);
                auVar163 = local_880._0_16_;
                auVar244 = local_8e0._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar234,auVar234);
                fVar104 = auVar83._0_4_;
              }
              local_a60._0_16_ = vdpps_avx(_local_840,local_9c0._0_16_,0x7f);
              auVar114 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar231._0_16_,
                                         ZEXT416((uint)local_ae0._0_4_));
              auVar83 = vdpps_avx(auVar244,local_9c0._0_16_,0x7f);
              auVar184 = vdpps_avx(_local_840,auVar163,0x7f);
              auVar234 = vdpps_avx(local_800._0_16_,local_9c0._0_16_,0x7f);
              auVar114 = vfmadd213ss_fma(ZEXT416((uint)(auVar231._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_820._0_4_ / fVar104)),auVar114)
              ;
              local_8e0._0_4_ = auVar114._0_4_;
              auVar80._0_4_ = local_a60._0_4_ * local_a60._0_4_;
              auVar80._4_4_ = local_a60._4_4_ * local_a60._4_4_;
              auVar80._8_4_ = local_a60._8_4_ * local_a60._8_4_;
              auVar80._12_4_ = local_a60._12_4_ * local_a60._12_4_;
              auVar114 = vdpps_avx(_local_840,auVar244,0x7f);
              auVar144 = vsubps_avx(local_7e0._0_16_,auVar80);
              auVar123 = vrsqrtss_avx(auVar144,auVar144);
              fVar72 = auVar144._0_4_;
              fVar104 = auVar123._0_4_;
              fVar104 = fVar104 * 1.5 + fVar72 * -0.5 * fVar104 * fVar104 * fVar104;
              auVar123 = vdpps_avx(_local_840,local_800._0_16_,0x7f);
              local_9c0._0_16_ = ZEXT416((uint)(auVar83._0_4_ + auVar184._0_4_));
              auVar83 = vfnmadd231ss_fma(auVar114,local_a60._0_16_,local_9c0._0_16_);
              auVar184 = vfnmadd231ss_fma(auVar123,local_a60._0_16_,auVar234);
              if (fVar72 < 0.0) {
                local_880._0_16_ = auVar234;
                local_680._0_16_ = auVar83;
                local_6a0._0_4_ = fVar104;
                _local_6c0 = auVar184;
                auVar231 = ZEXT1664(auVar231._0_16_);
                auVar275 = ZEXT1664(auVar275._0_16_);
                fVar72 = sqrtf(fVar72);
                fVar104 = (float)local_6a0._0_4_;
                auVar184 = _local_6c0;
                auVar234 = local_880._0_16_;
                auVar83 = local_680._0_16_;
              }
              else {
                auVar114 = vsqrtss_avx(auVar144,auVar144);
                fVar72 = auVar114._0_4_;
              }
              auVar114 = vpermilps_avx(local_640._0_16_,0xff);
              auVar123 = vpermilps_avx(local_980._0_16_,0xff);
              auVar83 = vfmsub213ss_fma(auVar83,ZEXT416((uint)fVar104),auVar123);
              auVar164._0_8_ = auVar234._0_8_ ^ 0x8000000080000000;
              auVar164._8_4_ = auVar234._8_4_ ^ 0x80000000;
              auVar164._12_4_ = auVar234._12_4_ ^ 0x80000000;
              auVar185._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar185._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar185._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar144 = ZEXT416((uint)(auVar184._0_4_ * fVar104));
              auVar184 = vfmsub231ss_fma(ZEXT416((uint)(auVar234._0_4_ * auVar83._0_4_)),
                                         local_9c0._0_16_,auVar144);
              auVar83 = vinsertps_avx(auVar144,auVar164,0x10);
              uVar71 = auVar184._0_4_;
              auVar165._4_4_ = uVar71;
              auVar165._0_4_ = uVar71;
              auVar165._8_4_ = uVar71;
              auVar165._12_4_ = uVar71;
              auVar83 = vdivps_avx(auVar83,auVar165);
              auVar114 = ZEXT416((uint)(fVar72 - auVar114._0_4_));
              auVar234 = vinsertps_avx(local_a60._0_16_,auVar114,0x10);
              auVar145._0_4_ = auVar234._0_4_ * auVar83._0_4_;
              auVar145._4_4_ = auVar234._4_4_ * auVar83._4_4_;
              auVar145._8_4_ = auVar234._8_4_ * auVar83._8_4_;
              auVar145._12_4_ = auVar234._12_4_ * auVar83._12_4_;
              auVar83 = vinsertps_avx(auVar185,local_9c0._0_16_,0x1c);
              auVar83 = vdivps_avx(auVar83,auVar165);
              auVar184 = vhaddps_avx(auVar145,auVar145);
              auVar166._0_4_ = auVar234._0_4_ * auVar83._0_4_;
              auVar166._4_4_ = auVar234._4_4_ * auVar83._4_4_;
              auVar166._8_4_ = auVar234._8_4_ * auVar83._8_4_;
              auVar166._12_4_ = auVar234._12_4_ * auVar83._12_4_;
              auVar83 = vhaddps_avx(auVar166,auVar166);
              fVar72 = (float)local_a80._0_4_ - auVar184._0_4_;
              local_a80._0_16_ = ZEXT416((uint)fVar72);
              fVar104 = (float)local_ac0._0_4_ - auVar83._0_4_;
              _local_ac0 = ZEXT416((uint)fVar104);
              auVar83 = vandps_avx(local_a60._0_16_,local_a40);
              bVar30 = true;
              auVar201 = local_9a0._0_28_;
              if ((float)local_8e0._0_4_ <= auVar83._0_4_) {
LAB_016e213b:
                auVar249 = ZEXT3264(local_940);
                auVar216 = ZEXT3264(local_960);
              }
              else {
                auVar184 = vfmadd231ss_fma(ZEXT416((uint)((float)local_8e0._0_4_ +
                                                         (float)local_ae0._0_4_)),local_6e0._0_16_,
                                           ZEXT416(0x36000000));
                auVar83 = vandps_avx(auVar114,local_a40);
                if (auVar184._0_4_ <= auVar83._0_4_) goto LAB_016e213b;
                fVar104 = fVar104 + (float)local_7b0._0_4_;
                bVar30 = false;
                auVar249 = ZEXT3264(local_940);
                _local_ac0 = ZEXT416((uint)fVar104);
                if (fVar104 < (ray->org).field_0.m128[3]) {
                  unaff_R14B = 0;
                  goto LAB_016e213b;
                }
                if (ray->tfar < fVar104) {
                  unaff_R14B = 0;
                  goto LAB_016e213b;
                }
                auVar216 = ZEXT3264(local_960);
                if ((fVar72 < 0.0) || (1.0 < fVar72)) {
LAB_016e2161:
                  bVar30 = false;
                  unaff_R14B = 0;
                }
                else {
                  local_ae0._0_4_ = ray->tfar;
                  auVar83 = vrsqrtss_avx(local_7e0._0_16_,local_7e0._0_16_);
                  fVar136 = auVar83._0_4_;
                  pGVar4 = (context->scene->geometries).items[local_a88].ptr;
                  if ((pGVar4->mask & ray->mask) == 0) goto LAB_016e2161;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    unaff_R14B = 1;
                  }
                  else {
                    fVar136 = fVar136 * 1.5 + local_7e0._0_4_ * -0.5 * fVar136 * fVar136 * fVar136;
                    auVar115._0_4_ = fVar136 * (float)local_840._0_4_;
                    auVar115._4_4_ = fVar136 * (float)local_840._4_4_;
                    auVar115._8_4_ = fVar136 * fStack_838;
                    auVar115._12_4_ = fVar136 * fStack_834;
                    auVar114 = vfmadd213ps_fma(auVar123,auVar115,local_980._0_16_);
                    auVar83 = vshufps_avx(auVar115,auVar115,0xc9);
                    auVar184 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                    auVar116._0_4_ = auVar115._0_4_ * auVar184._0_4_;
                    auVar116._4_4_ = auVar115._4_4_ * auVar184._4_4_;
                    auVar116._8_4_ = auVar115._8_4_ * auVar184._8_4_;
                    auVar116._12_4_ = auVar115._12_4_ * auVar184._12_4_;
                    auVar234 = vfmsub231ps_fma(auVar116,local_980._0_16_,auVar83);
                    auVar83 = vshufps_avx(auVar234,auVar234,0xc9);
                    auVar184 = vshufps_avx(auVar114,auVar114,0xc9);
                    auVar234 = vshufps_avx(auVar234,auVar234,0xd2);
                    auVar81._0_4_ = auVar114._0_4_ * auVar234._0_4_;
                    auVar81._4_4_ = auVar114._4_4_ * auVar234._4_4_;
                    auVar81._8_4_ = auVar114._8_4_ * auVar234._8_4_;
                    auVar81._12_4_ = auVar114._12_4_ * auVar234._12_4_;
                    auVar184 = vfmsub231ps_fma(auVar81,auVar83,auVar184);
                    auVar83 = vshufps_avx(auVar184,auVar184,0xe9);
                    local_920 = vmovlps_avx(auVar83);
                    local_918 = auVar184._0_4_;
                    local_910 = 0;
                    local_90c = (undefined4)local_8e8;
                    local_908 = (undefined4)local_a88;
                    local_904 = context->user->instID[0];
                    local_900 = context->user->instPrimID[0];
                    ray->tfar = fVar104;
                    local_ae4 = -1;
                    local_9f0.valid = &local_ae4;
                    local_9f0.geometryUserPtr = pGVar4->userPtr;
                    local_9f0.context = context->user;
                    local_9f0.hit = (RTCHitN *)&local_920;
                    local_9f0.N = 1;
                    local_9f0.ray = (RTCRayN *)ray;
                    local_914 = fVar72;
                    if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016e22dd:
                      p_Var5 = context->args->filter;
                      fVar104 = (float)local_ae0._0_4_;
                      if (p_Var5 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                          auVar231 = ZEXT1664(auVar231._0_16_);
                          auVar275 = ZEXT1664(auVar275._0_16_);
                          (*p_Var5)(&local_9f0);
                          auVar201 = local_9a0._0_28_;
                          auVar216 = ZEXT3264(local_960);
                          auVar249 = ZEXT3264(local_940);
                        }
                        fVar104 = (float)local_ae0._0_4_;
                        if (*local_9f0.valid == 0) {
                          unaff_R14B = 0;
                          goto LAB_016e236a;
                        }
                      }
                      unaff_R14B = 1;
                    }
                    else {
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      (*pGVar4->occlusionFilterN)(&local_9f0);
                      auVar201 = local_9a0._0_28_;
                      auVar216 = ZEXT3264(local_960);
                      auVar249 = ZEXT3264(local_940);
                      if (*local_9f0.valid != 0) goto LAB_016e22dd;
                      unaff_R14B = 0;
                      fVar104 = (float)local_ae0._0_4_;
                    }
LAB_016e236a:
                    if (unaff_R14B == 0) {
                      ray->tfar = fVar104;
                    }
                  }
                  bVar30 = false;
                }
              }
              if (!bVar30) goto LAB_016e2381;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            unaff_R14B = 0;
LAB_016e2381:
            unaff_R14B = unaff_R14B & 1;
            bVar67 = bVar67 | unaff_R14B;
            fVar104 = ray->tfar;
            auVar98._4_4_ = fVar104;
            auVar98._0_4_ = fVar104;
            auVar98._8_4_ = fVar104;
            auVar98._12_4_ = fVar104;
            auVar98._16_4_ = fVar104;
            auVar98._20_4_ = fVar104;
            auVar98._24_4_ = fVar104;
            auVar98._28_4_ = fVar104;
            auVar248 = vcmpps_avx(_local_780,auVar98,2);
            auVar97 = vandps_avx(auVar248,local_580);
            auVar101 = ZEXT3264(auVar97);
            auVar248 = local_580 & auVar248;
            auVar262 = local_8a0;
            auVar256 = local_8c0;
            local_580 = auVar97;
          } while ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar248 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar248 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar248 >> 0x7f,0) != '\0') ||
                     (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar248 >> 0xbf,0) != '\0') ||
                   (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar248[0x1f] < '\0');
        }
        auVar102._0_4_ = auVar201._0_4_ * (float)local_620._0_4_;
        auVar102._4_4_ = auVar201._4_4_ * (float)local_620._4_4_;
        auVar102._8_4_ = auVar201._8_4_ * fStack_618;
        auVar102._12_4_ = auVar201._12_4_ * fStack_614;
        auVar102._16_4_ = auVar201._16_4_ * fStack_610;
        auVar102._20_4_ = auVar201._20_4_ * fStack_60c;
        auVar102._28_36_ = auVar101._28_36_;
        auVar102._24_4_ = auVar201._24_4_ * fStack_608;
        auVar83 = vfmadd213ps_fma(local_600,auVar256,auVar102._0_32_);
        auVar83 = vfmadd213ps_fma(local_5e0,auVar262,ZEXT1632(auVar83));
        auVar58._4_4_ = uStack_75c;
        auVar58._0_4_ = local_760;
        auVar58._8_4_ = uStack_758;
        auVar58._12_4_ = uStack_754;
        auVar58._16_4_ = uStack_750;
        auVar58._20_4_ = uStack_74c;
        auVar58._24_4_ = uStack_748;
        auVar58._28_4_ = uStack_744;
        auVar97 = vandps_avx(ZEXT1632(auVar83),auVar58);
        auVar131._8_4_ = 0x3e99999a;
        auVar131._0_8_ = 0x3e99999a3e99999a;
        auVar131._12_4_ = 0x3e99999a;
        auVar131._16_4_ = 0x3e99999a;
        auVar131._20_4_ = 0x3e99999a;
        auVar131._24_4_ = 0x3e99999a;
        auVar131._28_4_ = 0x3e99999a;
        auVar97 = vcmpps_avx(auVar97,auVar131,1);
        auVar248 = vorps_avx(auVar97,local_560);
        auVar132._0_4_ = (float)local_860._0_4_ + (float)local_520._0_4_;
        auVar132._4_4_ = (float)local_860._4_4_ + (float)local_520._4_4_;
        auVar132._8_4_ = fStack_858 + fStack_518;
        auVar132._12_4_ = fStack_854 + fStack_514;
        auVar132._16_4_ = fStack_850 + fStack_510;
        auVar132._20_4_ = fStack_84c + fStack_50c;
        auVar132._24_4_ = fStack_848 + fStack_508;
        auVar132._28_4_ = fStack_844 + fStack_504;
        fVar104 = ray->tfar;
        auVar153._4_4_ = fVar104;
        auVar153._0_4_ = fVar104;
        auVar153._8_4_ = fVar104;
        auVar153._12_4_ = fVar104;
        auVar153._16_4_ = fVar104;
        auVar153._20_4_ = fVar104;
        auVar153._24_4_ = fVar104;
        auVar153._28_4_ = fVar104;
        auVar97 = vcmpps_avx(auVar132,auVar153,2);
        local_6e0 = vandps_avx(auVar97,local_540);
        auVar133._8_4_ = 3;
        auVar133._0_8_ = 0x300000003;
        auVar133._12_4_ = 3;
        auVar133._16_4_ = 3;
        auVar133._20_4_ = 3;
        auVar133._24_4_ = 3;
        auVar133._28_4_ = 3;
        auVar154._8_4_ = 2;
        auVar154._0_8_ = 0x200000002;
        auVar154._12_4_ = 2;
        auVar154._16_4_ = 2;
        auVar154._20_4_ = 2;
        auVar154._24_4_ = 2;
        auVar154._28_4_ = 2;
        auVar97 = vblendvps_avx(auVar154,auVar133,auVar248);
        _local_780 = vpcmpgtd_avx2(auVar97,local_340);
        auVar97 = vpandn_avx2(_local_780,local_6e0);
        auVar248 = local_6e0 & ~_local_780;
        if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar248 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar248 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar248 >> 0x7f,0) != '\0') ||
              (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar248 >> 0xbf,0) != '\0') ||
            (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar248[0x1f] < '\0') {
          auVar184 = vminps_avx(local_a00,local_a20);
          auVar83 = vmaxps_avx(local_a00,local_a20);
          auVar234 = vminps_avx(local_a10,_local_a30);
          auVar114 = vminps_avx(auVar184,auVar234);
          auVar184 = vmaxps_avx(local_a10,_local_a30);
          auVar234 = vmaxps_avx(auVar83,auVar184);
          auVar83 = vandps_avx(auVar114,local_a40);
          auVar184 = vandps_avx(auVar234,local_a40);
          auVar83 = vmaxps_avx(auVar83,auVar184);
          auVar184 = vmovshdup_avx(auVar83);
          auVar184 = vmaxss_avx(auVar184,auVar83);
          auVar83 = vshufpd_avx(auVar83,auVar83,1);
          auVar83 = vmaxss_avx(auVar83,auVar184);
          local_820._0_4_ = auVar83._0_4_ * 1.9073486e-06;
          local_680._0_16_ = vshufps_avx(auVar234,auVar234,0xff);
          local_6a0 = _local_420;
          local_6c0._4_4_ = (float)local_420._4_4_ + (float)local_860._4_4_;
          local_6c0._0_4_ = (float)local_420._0_4_ + (float)local_860._0_4_;
          fStack_6b8 = fStack_418 + fStack_858;
          fStack_6b4 = fStack_414 + fStack_854;
          fStack_6b0 = fStack_410 + fStack_850;
          fStack_6ac = fStack_40c + fStack_84c;
          fStack_6a8 = fStack_408 + fStack_848;
          fStack_6a4 = fStack_404 + fStack_844;
          do {
            auVar134._8_4_ = 0x7f800000;
            auVar134._0_8_ = 0x7f8000007f800000;
            auVar134._12_4_ = 0x7f800000;
            auVar134._16_4_ = 0x7f800000;
            auVar134._20_4_ = 0x7f800000;
            auVar134._24_4_ = 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar248 = vblendvps_avx(auVar134,local_6a0,auVar97);
            auVar7 = vshufps_avx(auVar248,auVar248,0xb1);
            auVar7 = vminps_avx(auVar248,auVar7);
            auVar228 = vshufpd_avx(auVar7,auVar7,5);
            auVar7 = vminps_avx(auVar7,auVar228);
            auVar228 = vpermpd_avx2(auVar7,0x4e);
            auVar7 = vminps_avx(auVar7,auVar228);
            auVar7 = vcmpps_avx(auVar248,auVar7,0);
            auVar228 = auVar97 & auVar7;
            auVar248 = auVar97;
            if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar228 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar228 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar228 >> 0x7f,0) != '\0') ||
                  (auVar228 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar228 >> 0xbf,0) != '\0') ||
                (auVar228 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar228[0x1f] < '\0') {
              auVar248 = vandps_avx(auVar7,auVar97);
            }
            uVar65 = vmovmskps_avx(auVar248);
            iVar10 = 0;
            for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
              iVar10 = iVar10 + 1;
            }
            uVar65 = iVar10 << 2;
            local_5a0 = auVar97;
            *(undefined4 *)(local_5a0 + uVar65) = 0;
            aVar1 = (ray->dir).field_0;
            local_800._0_16_ = (undefined1  [16])aVar1;
            auVar83 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            auVar101 = ZEXT464(*(uint *)(local_480 + uVar65));
            if (auVar83._0_4_ < 0.0) {
              _local_ac0 = ZEXT416(*(uint *)(local_480 + uVar65));
              local_a80._0_16_ = ZEXT416((uint)*(float *)(local_400 + uVar65));
              auVar275 = ZEXT1664(auVar275._0_16_);
              fVar72 = sqrtf(auVar83._0_4_);
              auVar101 = ZEXT1664(_local_ac0);
              fVar104 = (float)local_a80._0_4_;
              uVar71 = local_a80._4_4_;
              uVar264 = local_a80._8_4_;
              uVar265 = local_a80._12_4_;
            }
            else {
              auVar83 = vsqrtss_avx(auVar83,auVar83);
              fVar72 = auVar83._0_4_;
              fVar104 = *(float *)(local_400 + uVar65);
              uVar71 = 0;
              uVar264 = 0;
              uVar265 = 0;
            }
            local_660._0_4_ = fVar72 * 1.9073486e-06;
            lVar68 = 5;
            do {
              auVar97 = local_a80;
              fVar136 = auVar101._0_4_;
              fVar72 = 1.0 - fVar136;
              auVar117._0_4_ = local_a20._0_4_ * fVar136;
              auVar117._4_4_ = local_a20._4_4_ * fVar136;
              auVar117._8_4_ = local_a20._8_4_ * fVar136;
              auVar117._12_4_ = local_a20._12_4_ * fVar136;
              auVar146._4_4_ = fVar72;
              auVar146._0_4_ = fVar72;
              auVar146._8_4_ = fVar72;
              auVar146._12_4_ = fVar72;
              auVar83 = vfmadd231ps_fma(auVar117,auVar146,local_a00);
              auVar167._0_4_ = local_a10._0_4_ * fVar136;
              auVar167._4_4_ = local_a10._4_4_ * fVar136;
              auVar167._8_4_ = local_a10._8_4_ * fVar136;
              auVar167._12_4_ = local_a10._12_4_ * fVar136;
              auVar184 = vfmadd231ps_fma(auVar167,auVar146,local_a20);
              auVar199._0_4_ = fVar136 * auVar184._0_4_;
              auVar199._4_4_ = fVar136 * auVar184._4_4_;
              auVar199._8_4_ = fVar136 * auVar184._8_4_;
              auVar199._12_4_ = fVar136 * auVar184._12_4_;
              local_980._0_16_ = vfmadd231ps_fma(auVar199,auVar146,auVar83);
              auVar118._0_4_ = fVar136 * (float)local_a30._0_4_;
              auVar118._4_4_ = fVar136 * (float)local_a30._4_4_;
              auVar118._8_4_ = fVar136 * fStack_a28;
              auVar118._12_4_ = fVar136 * fStack_a24;
              auVar83 = vfmadd231ps_fma(auVar118,auVar146,local_a10);
              auVar186._0_4_ = fVar136 * auVar83._0_4_;
              auVar186._4_4_ = fVar136 * auVar83._4_4_;
              auVar186._8_4_ = fVar136 * auVar83._8_4_;
              auVar186._12_4_ = fVar136 * auVar83._12_4_;
              auVar184 = vfmadd231ps_fma(auVar186,auVar146,auVar184);
              auVar119._4_4_ = fVar104;
              auVar119._0_4_ = fVar104;
              auVar119._8_4_ = fVar104;
              auVar119._12_4_ = fVar104;
              auVar83 = vfmadd213ps_fma(auVar119,local_800._0_16_,_DAT_01feba10);
              auVar82._0_4_ = fVar136 * auVar184._0_4_;
              auVar82._4_4_ = fVar136 * auVar184._4_4_;
              auVar82._8_4_ = fVar136 * auVar184._8_4_;
              auVar82._12_4_ = fVar136 * auVar184._12_4_;
              auVar234 = vfmadd231ps_fma(auVar82,local_980._0_16_,auVar146);
              local_640._0_16_ = auVar234;
              auVar83 = vsubps_avx(auVar83,auVar234);
              _local_840 = auVar83;
              auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
              _local_ac0 = auVar101._0_16_;
              local_a80._4_4_ = uVar71;
              local_a80._0_4_ = fVar104;
              local_a80._8_4_ = uVar264;
              local_a80._16_16_ = auVar97._16_16_;
              local_a80._12_4_ = uVar265;
              local_7e0._0_16_ = auVar83;
              if (auVar83._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar72);
                local_a60._0_16_ = auVar184;
                auVar275 = ZEXT1664(auVar275._0_16_);
                auVar103._0_4_ = sqrtf(auVar83._0_4_);
                auVar103._4_60_ = extraout_var_00;
                auVar83 = auVar103._0_16_;
                auVar184 = local_a60._0_16_;
                auVar234 = local_ae0._0_16_;
                auVar114 = _local_ac0;
                fVar104 = (float)local_a80._0_4_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                auVar234 = ZEXT416((uint)fVar72);
                auVar114 = auVar101._0_16_;
              }
              auVar184 = vsubps_avx(auVar184,local_980._0_16_);
              local_980._0_4_ = auVar184._0_4_ * 3.0;
              local_980._4_4_ = auVar184._4_4_ * 3.0;
              local_980._8_4_ = auVar184._8_4_ * 3.0;
              local_980._12_4_ = auVar184._12_4_ * 3.0;
              auVar184 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar234,auVar114);
              auVar123 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar114,auVar234);
              fVar72 = auVar234._0_4_ * 6.0;
              fVar136 = auVar184._0_4_ * 6.0;
              fVar224 = auVar123._0_4_ * 6.0;
              fVar141 = auVar114._0_4_ * 6.0;
              auVar168._0_4_ = fVar141 * (float)local_a30._0_4_;
              auVar168._4_4_ = fVar141 * (float)local_a30._4_4_;
              auVar168._8_4_ = fVar141 * fStack_a28;
              auVar168._12_4_ = fVar141 * fStack_a24;
              auVar120._4_4_ = fVar224;
              auVar120._0_4_ = fVar224;
              auVar120._8_4_ = fVar224;
              auVar120._12_4_ = fVar224;
              auVar184 = vfmadd132ps_fma(auVar120,auVar168,local_a10);
              auVar169._4_4_ = fVar136;
              auVar169._0_4_ = fVar136;
              auVar169._8_4_ = fVar136;
              auVar169._12_4_ = fVar136;
              auVar184 = vfmadd132ps_fma(auVar169,auVar184,local_a20);
              auVar234 = vdpps_avx(local_980._0_16_,local_980._0_16_,0x7f);
              auVar121._4_4_ = fVar72;
              auVar121._0_4_ = fVar72;
              auVar121._8_4_ = fVar72;
              auVar121._12_4_ = fVar72;
              auVar123 = vfmadd132ps_fma(auVar121,auVar184,local_a00);
              auVar184 = vblendps_avx(auVar234,_DAT_01feba10,0xe);
              auVar114 = vrsqrtss_avx(auVar184,auVar184);
              fVar224 = auVar234._0_4_;
              fVar72 = auVar114._0_4_;
              auVar114 = vdpps_avx(local_980._0_16_,auVar123,0x7f);
              fVar72 = fVar72 * 1.5 + fVar224 * -0.5 * fVar72 * fVar72 * fVar72;
              auVar122._0_4_ = auVar123._0_4_ * fVar224;
              auVar122._4_4_ = auVar123._4_4_ * fVar224;
              auVar122._8_4_ = auVar123._8_4_ * fVar224;
              auVar122._12_4_ = auVar123._12_4_ * fVar224;
              fVar136 = auVar114._0_4_;
              auVar200._0_4_ = local_980._0_4_ * fVar136;
              auVar200._4_4_ = local_980._4_4_ * fVar136;
              auVar200._8_4_ = local_980._8_4_ * fVar136;
              auVar200._12_4_ = local_980._12_4_ * fVar136;
              auVar114 = vsubps_avx(auVar122,auVar200);
              auVar184 = vrcpss_avx(auVar184,auVar184);
              auVar123 = vfnmadd213ss_fma(auVar184,auVar234,ZEXT416(0x40000000));
              fVar136 = auVar184._0_4_ * auVar123._0_4_;
              auVar184 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                    ZEXT416((uint)(fVar104 * (float)local_660._0_4_)));
              local_ae0._0_4_ = auVar184._0_4_;
              uVar70 = CONCAT44(local_980._4_4_,local_980._0_4_);
              local_8e0._0_8_ = uVar70 ^ 0x8000000080000000;
              local_8e0._8_4_ = -local_980._8_4_;
              local_8e0._12_4_ = -local_980._12_4_;
              auVar170._0_4_ = fVar72 * auVar114._0_4_ * fVar136;
              auVar170._4_4_ = fVar72 * auVar114._4_4_ * fVar136;
              auVar170._8_4_ = fVar72 * auVar114._8_4_ * fVar136;
              auVar170._12_4_ = fVar72 * auVar114._12_4_ * fVar136;
              local_9c0._0_4_ = local_980._0_4_ * fVar72;
              local_9c0._4_4_ = local_980._4_4_ * fVar72;
              local_9c0._8_4_ = local_980._8_4_ * fVar72;
              local_9c0._12_4_ = local_980._12_4_ * fVar72;
              if (fVar224 < -fVar224) {
                local_a60._0_4_ = auVar83._0_4_;
                _local_9a0 = auVar170;
                auVar275 = ZEXT1664(auVar275._0_16_);
                fVar104 = sqrtf(fVar224);
                auVar83 = ZEXT416((uint)local_a60._0_4_);
                auVar170 = _local_9a0;
              }
              else {
                auVar184 = vsqrtss_avx(auVar234,auVar234);
                fVar104 = auVar184._0_4_;
              }
              auVar184 = vdpps_avx(_local_840,local_9c0._0_16_,0x7f);
              auVar144 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar83,
                                         ZEXT416((uint)local_ae0._0_4_));
              auVar234 = vdpps_avx(local_8e0._0_16_,local_9c0._0_16_,0x7f);
              auVar114 = vdpps_avx(_local_840,auVar170,0x7f);
              auVar123 = vdpps_avx(local_800._0_16_,local_9c0._0_16_,0x7f);
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(auVar83._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_820._0_4_ / fVar104)),auVar144);
              local_a60._0_4_ = auVar83._0_4_;
              auVar84._0_4_ = auVar184._0_4_ * auVar184._0_4_;
              auVar84._4_4_ = auVar184._4_4_ * auVar184._4_4_;
              auVar84._8_4_ = auVar184._8_4_ * auVar184._8_4_;
              auVar84._12_4_ = auVar184._12_4_ * auVar184._12_4_;
              auVar83 = vdpps_avx(_local_840,local_8e0._0_16_,0x7f);
              auVar77 = vsubps_avx(local_7e0._0_16_,auVar84);
              auVar144 = vrsqrtss_avx(auVar77,auVar77);
              fVar72 = auVar77._0_4_;
              fVar104 = auVar144._0_4_;
              fVar104 = fVar104 * 1.5 + fVar72 * -0.5 * fVar104 * fVar104 * fVar104;
              auVar144 = vdpps_avx(_local_840,local_800._0_16_,0x7f);
              local_8e0._0_16_ = ZEXT416((uint)(auVar234._0_4_ + auVar114._0_4_));
              local_9c0._0_16_ = vfnmadd231ss_fma(auVar83,auVar184,local_8e0._0_16_);
              auVar83 = vfnmadd231ss_fma(auVar144,auVar184,auVar123);
              if (fVar72 < 0.0) {
                _local_9a0 = auVar184;
                local_8a0._0_16_ = auVar123;
                local_8c0._0_4_ = fVar104;
                local_880._0_16_ = auVar83;
                auVar275 = ZEXT1664(auVar275._0_16_);
                fVar72 = sqrtf(fVar72);
                fVar104 = (float)local_8c0._0_4_;
                auVar83 = local_880._0_16_;
                auVar184 = _local_9a0;
                auVar123 = local_8a0._0_16_;
              }
              else {
                auVar234 = vsqrtss_avx(auVar77,auVar77);
                fVar72 = auVar234._0_4_;
              }
              auVar231 = ZEXT1664(auVar184);
              auVar249 = ZEXT3264(local_940);
              auVar216 = ZEXT3264(local_960);
              auVar234 = vpermilps_avx(local_640._0_16_,0xff);
              auVar144 = vpermilps_avx(local_980._0_16_,0xff);
              auVar114 = vfmsub213ss_fma(local_9c0._0_16_,ZEXT416((uint)fVar104),auVar144);
              auVar171._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
              auVar171._8_4_ = auVar123._8_4_ ^ 0x80000000;
              auVar171._12_4_ = auVar123._12_4_ ^ 0x80000000;
              auVar187._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar187._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar187._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar83 = ZEXT416((uint)(auVar83._0_4_ * fVar104));
              auVar114 = vfmsub231ss_fma(ZEXT416((uint)(auVar123._0_4_ * auVar114._0_4_)),
                                         local_8e0._0_16_,auVar83);
              auVar83 = vinsertps_avx(auVar83,auVar171,0x10);
              uVar71 = auVar114._0_4_;
              auVar172._4_4_ = uVar71;
              auVar172._0_4_ = uVar71;
              auVar172._8_4_ = uVar71;
              auVar172._12_4_ = uVar71;
              auVar83 = vdivps_avx(auVar83,auVar172);
              auVar123 = ZEXT416((uint)(fVar72 - auVar234._0_4_));
              auVar114 = vinsertps_avx(auVar184,auVar123,0x10);
              auVar147._0_4_ = auVar114._0_4_ * auVar83._0_4_;
              auVar147._4_4_ = auVar114._4_4_ * auVar83._4_4_;
              auVar147._8_4_ = auVar114._8_4_ * auVar83._8_4_;
              auVar147._12_4_ = auVar114._12_4_ * auVar83._12_4_;
              auVar83 = vinsertps_avx(auVar187,local_8e0._0_16_,0x1c);
              auVar83 = vdivps_avx(auVar83,auVar172);
              auVar234 = vhaddps_avx(auVar147,auVar147);
              auVar173._0_4_ = auVar114._0_4_ * auVar83._0_4_;
              auVar173._4_4_ = auVar114._4_4_ * auVar83._4_4_;
              auVar173._8_4_ = auVar114._8_4_ * auVar83._8_4_;
              auVar173._12_4_ = auVar114._12_4_ * auVar83._12_4_;
              auVar83 = vhaddps_avx(auVar173,auVar173);
              fVar72 = (float)local_ac0._0_4_ - auVar234._0_4_;
              auVar101 = ZEXT464((uint)fVar72);
              fVar104 = (float)local_a80._0_4_ - auVar83._0_4_;
              uVar71 = 0;
              uVar264 = 0;
              uVar265 = 0;
              auVar83 = vandps_avx(auVar184,local_a40);
              bVar30 = true;
              if (auVar83._0_4_ < (float)local_a60._0_4_) {
                auVar234 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a60._0_4_ +
                                                         (float)local_ae0._0_4_)),local_680._0_16_,
                                           ZEXT416(0x36000000));
                auVar83 = vandps_avx(auVar123,local_a40);
                if (auVar83._0_4_ < auVar234._0_4_) {
                  fVar104 = fVar104 + (float)local_7b0._0_4_;
                  uVar71 = 0;
                  uVar264 = 0;
                  uVar265 = 0;
                  if (((((ray->org).field_0.m128[3] <= fVar104) && (fVar104 <= ray->tfar)) &&
                      (0.0 <= fVar72)) && (fVar72 <= 1.0)) {
                    auVar83 = vrsqrtss_avx(local_7e0._0_16_,local_7e0._0_16_);
                    fVar136 = auVar83._0_4_;
                    pGVar4 = (context->scene->geometries).items[local_a88].ptr;
                    if ((pGVar4->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R14B = 1;
                      }
                      else {
                        local_ae0._0_4_ = ray->tfar;
                        fVar136 = fVar136 * 1.5 +
                                  local_7e0._0_4_ * -0.5 * fVar136 * fVar136 * fVar136;
                        auVar124._0_4_ = fVar136 * (float)local_840._0_4_;
                        auVar124._4_4_ = fVar136 * (float)local_840._4_4_;
                        auVar124._8_4_ = fVar136 * fStack_838;
                        auVar124._12_4_ = fVar136 * fStack_834;
                        auVar123 = vfmadd213ps_fma(auVar144,auVar124,local_980._0_16_);
                        auVar83 = vshufps_avx(auVar124,auVar124,0xc9);
                        auVar234 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                        auVar125._0_4_ = auVar124._0_4_ * auVar234._0_4_;
                        auVar125._4_4_ = auVar124._4_4_ * auVar234._4_4_;
                        auVar125._8_4_ = auVar124._8_4_ * auVar234._8_4_;
                        auVar125._12_4_ = auVar124._12_4_ * auVar234._12_4_;
                        auVar114 = vfmsub231ps_fma(auVar125,local_980._0_16_,auVar83);
                        auVar83 = vshufps_avx(auVar114,auVar114,0xc9);
                        auVar234 = vshufps_avx(auVar123,auVar123,0xc9);
                        auVar114 = vshufps_avx(auVar114,auVar114,0xd2);
                        auVar85._0_4_ = auVar123._0_4_ * auVar114._0_4_;
                        auVar85._4_4_ = auVar123._4_4_ * auVar114._4_4_;
                        auVar85._8_4_ = auVar123._8_4_ * auVar114._8_4_;
                        auVar85._12_4_ = auVar123._12_4_ * auVar114._12_4_;
                        auVar234 = vfmsub231ps_fma(auVar85,auVar83,auVar234);
                        auVar83 = vshufps_avx(auVar234,auVar234,0xe9);
                        local_920 = vmovlps_avx(auVar83);
                        local_918 = auVar234._0_4_;
                        local_910 = 0;
                        local_90c = (undefined4)local_8e8;
                        local_908 = (undefined4)local_a88;
                        local_904 = context->user->instID[0];
                        local_900 = context->user->instPrimID[0];
                        ray->tfar = fVar104;
                        local_ae4 = -1;
                        local_9f0.valid = &local_ae4;
                        local_9f0.geometryUserPtr = pGVar4->userPtr;
                        local_9f0.context = context->user;
                        local_9f0.hit = (RTCHitN *)&local_920;
                        local_9f0.N = 1;
                        _local_ac0 = ZEXT416((uint)fVar72);
                        local_a80._0_16_ = ZEXT416((uint)fVar104);
                        local_9f0.ray = (RTCRayN *)ray;
                        local_914 = fVar72;
                        if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016e2c91:
                          p_Var5 = context->args->filter;
                          fVar72 = (float)local_ae0._0_4_;
                          if (p_Var5 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                              auVar231 = ZEXT1664(auVar231._0_16_);
                              auVar275 = ZEXT1664(auVar275._0_16_);
                              (*p_Var5)(&local_9f0);
                              auVar101 = ZEXT1664(_local_ac0);
                              auVar216 = ZEXT3264(local_960);
                              auVar249 = ZEXT3264(local_940);
                              fVar104 = (float)local_a80._0_4_;
                              uVar71 = local_a80._4_4_;
                              uVar264 = local_a80._8_4_;
                              uVar265 = local_a80._12_4_;
                            }
                            fVar72 = (float)local_ae0._0_4_;
                            if (*local_9f0.valid == 0) {
                              unaff_R14B = 0;
                              goto LAB_016e2d09;
                            }
                          }
                          unaff_R14B = 1;
                        }
                        else {
                          auVar231 = ZEXT1664(auVar184);
                          auVar275 = ZEXT1664(auVar275._0_16_);
                          (*pGVar4->occlusionFilterN)(&local_9f0);
                          auVar101 = ZEXT1664(_local_ac0);
                          auVar216 = ZEXT3264(local_960);
                          auVar249 = ZEXT3264(local_940);
                          fVar104 = (float)local_a80._0_4_;
                          uVar71 = local_a80._4_4_;
                          uVar264 = local_a80._8_4_;
                          uVar265 = local_a80._12_4_;
                          if (*local_9f0.valid != 0) goto LAB_016e2c91;
                          unaff_R14B = 0;
                          fVar72 = (float)local_ae0._0_4_;
                        }
LAB_016e2d09:
                        if (unaff_R14B == 0) {
                          ray->tfar = fVar72;
                        }
                      }
                      bVar30 = false;
                      goto LAB_016e2b13;
                    }
                  }
                  bVar30 = false;
                  unaff_R14B = 0;
                }
              }
LAB_016e2b13:
              if (!bVar30) goto LAB_016e2d20;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            unaff_R14B = 0;
LAB_016e2d20:
            unaff_R14B = unaff_R14B & 1;
            bVar67 = bVar67 | unaff_R14B;
            fVar104 = ray->tfar;
            auVar99._4_4_ = fVar104;
            auVar99._0_4_ = fVar104;
            auVar99._8_4_ = fVar104;
            auVar99._12_4_ = fVar104;
            auVar99._16_4_ = fVar104;
            auVar99._20_4_ = fVar104;
            auVar99._24_4_ = fVar104;
            auVar99._28_4_ = fVar104;
            auVar248 = vcmpps_avx(_local_6c0,auVar99,2);
            auVar97 = vandps_avx(auVar248,local_5a0);
            local_5a0 = local_5a0 & auVar248;
          } while ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_5a0 >> 0x7f,0) != '\0') ||
                     (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_5a0 >> 0xbf,0) != '\0') ||
                   (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_5a0[0x1f] < '\0');
        }
        auVar135._0_4_ = (float)local_860._0_4_ + local_3e0._0_4_;
        auVar135._4_4_ = (float)local_860._4_4_ + local_3e0._4_4_;
        auVar135._8_4_ = fStack_858 + local_3e0._8_4_;
        auVar135._12_4_ = fStack_854 + local_3e0._12_4_;
        auVar135._16_4_ = fStack_850 + local_3e0._16_4_;
        auVar135._20_4_ = fStack_84c + local_3e0._20_4_;
        auVar135._24_4_ = fStack_848 + local_3e0._24_4_;
        auVar135._28_4_ = fStack_844 + local_3e0._28_4_;
        fVar104 = ray->tfar;
        auVar180._4_4_ = fVar104;
        auVar180._0_4_ = fVar104;
        auVar180._8_4_ = fVar104;
        auVar180._12_4_ = fVar104;
        auVar180._16_4_ = fVar104;
        auVar180._20_4_ = fVar104;
        auVar180._24_4_ = fVar104;
        auVar180._28_4_ = fVar104;
        auVar248 = vcmpps_avx(auVar135,auVar180,2);
        auVar97 = vandps_avx(local_500,local_4e0);
        auVar97 = vandps_avx(auVar248,auVar97);
        auVar191._0_4_ = (float)local_860._0_4_ + local_420._0_4_;
        auVar191._4_4_ = (float)local_860._4_4_ + local_420._4_4_;
        auVar191._8_4_ = fStack_858 + local_420._8_4_;
        auVar191._12_4_ = fStack_854 + local_420._12_4_;
        auVar191._16_4_ = fStack_850 + local_420._16_4_;
        auVar191._20_4_ = fStack_84c + local_420._20_4_;
        auVar191._24_4_ = fStack_848 + local_420._24_4_;
        auVar191._28_4_ = fStack_844 + local_420._28_4_;
        auVar7 = vcmpps_avx(auVar191,auVar180,2);
        auVar248 = vandps_avx(_local_780,local_6e0);
        auVar248 = vandps_avx(auVar7,auVar248);
        auVar248 = vorps_avx(auVar97,auVar248);
        if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar248 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar248 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar248 >> 0x7f,0) != '\0') ||
              (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar248 >> 0xbf,0) != '\0') ||
            (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar248[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar66 * 0x60) = auVar248;
          auVar97 = vblendvps_avx(_local_420,local_3e0,auVar97);
          *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x60) = auVar97;
          uVar73 = vmovlps_avx(local_7a0);
          *(undefined8 *)(afStack_140 + uVar66 * 0x18) = uVar73;
          auStack_138[uVar66 * 0x18] = (int)local_5c0 + 1;
          uVar66 = (ulong)((int)uVar66 + 1);
        }
      }
    }
    fVar104 = ray->tfar;
    auVar96._4_4_ = fVar104;
    auVar96._0_4_ = fVar104;
    auVar96._8_4_ = fVar104;
    auVar96._12_4_ = fVar104;
    auVar96._16_4_ = fVar104;
    auVar96._20_4_ = fVar104;
    auVar96._24_4_ = fVar104;
    auVar96._28_4_ = fVar104;
    fVar104 = (float)local_860._0_4_;
    fVar72 = (float)local_860._4_4_;
    fVar136 = fStack_858;
    fVar224 = fStack_854;
    fVar141 = fStack_850;
    fVar137 = fStack_84c;
    fVar225 = fStack_848;
    fVar138 = fStack_844;
    do {
      uVar65 = (uint)uVar66;
      if (uVar65 == 0) {
        if (bVar67 != 0) {
          return local_af1;
        }
        fVar104 = ray->tfar;
        auVar86._4_4_ = fVar104;
        auVar86._0_4_ = fVar104;
        auVar86._8_4_ = fVar104;
        auVar86._12_4_ = fVar104;
        auVar83 = vcmpps_avx(local_430,auVar86,2);
        uVar65 = vmovmskps_avx(auVar83);
        uVar65 = (uint)local_788 & uVar65;
        local_af1 = uVar65 != 0;
        if (!local_af1) {
          return local_af1;
        }
        goto LAB_016e099d;
      }
      uVar66 = (ulong)(uVar65 - 1);
      lVar68 = uVar66 * 0x60;
      auVar97 = *(undefined1 (*) [32])(auStack_160 + lVar68);
      auVar126._0_4_ = fVar104 + auVar97._0_4_;
      auVar126._4_4_ = fVar72 + auVar97._4_4_;
      auVar126._8_4_ = fVar136 + auVar97._8_4_;
      auVar126._12_4_ = fVar224 + auVar97._12_4_;
      auVar126._16_4_ = fVar141 + auVar97._16_4_;
      auVar126._20_4_ = fVar137 + auVar97._20_4_;
      auVar126._24_4_ = fVar225 + auVar97._24_4_;
      auVar126._28_4_ = fVar138 + auVar97._28_4_;
      auVar7 = vcmpps_avx(auVar126,auVar96,2);
      auVar248 = vandps_avx(auVar7,*(undefined1 (*) [32])(auStack_180 + lVar68));
      local_3e0 = auVar248;
      auVar7 = *(undefined1 (*) [32])(auStack_180 + lVar68) & auVar7;
      bVar52 = (auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar53 = (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar51 = (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar50 = SUB321(auVar7 >> 0x7f,0) == '\0';
      bVar49 = (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar48 = SUB321(auVar7 >> 0xbf,0) == '\0';
      bVar45 = (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar30 = -1 < auVar7[0x1f];
      if (((((((!bVar52 || !bVar53) || !bVar51) || !bVar50) || !bVar49) || !bVar48) || !bVar45) ||
          !bVar30) {
        auVar177._8_4_ = 0x7f800000;
        auVar177._0_8_ = 0x7f8000007f800000;
        auVar177._12_4_ = 0x7f800000;
        auVar177._16_4_ = 0x7f800000;
        auVar177._20_4_ = 0x7f800000;
        auVar177._24_4_ = 0x7f800000;
        auVar177._28_4_ = 0x7f800000;
        auVar97 = vblendvps_avx(auVar177,auVar97,auVar248);
        auVar7 = vshufps_avx(auVar97,auVar97,0xb1);
        auVar7 = vminps_avx(auVar97,auVar7);
        auVar228 = vshufpd_avx(auVar7,auVar7,5);
        auVar7 = vminps_avx(auVar7,auVar228);
        auVar228 = vpermpd_avx2(auVar7,0x4e);
        auVar7 = vminps_avx(auVar7,auVar228);
        auVar97 = vcmpps_avx(auVar97,auVar7,0);
        auVar7 = auVar248 & auVar97;
        if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar7 >> 0x7f,0) != '\0') ||
              (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar7 >> 0xbf,0) != '\0') ||
            (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar7[0x1f] < '\0') {
          auVar248 = vandps_avx(auVar97,auVar248);
        }
        fVar104 = afStack_140[uVar66 * 0x18 + 1];
        local_5c0 = (ulong)auStack_138[uVar66 * 0x18];
        uVar69 = vmovmskps_avx(auVar248);
        iVar10 = 0;
        for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
          iVar10 = iVar10 + 1;
        }
        fVar72 = afStack_140[uVar66 * 0x18];
        auVar127._4_4_ = fVar72;
        auVar127._0_4_ = fVar72;
        auVar127._8_4_ = fVar72;
        auVar127._12_4_ = fVar72;
        auVar127._16_4_ = fVar72;
        auVar127._20_4_ = fVar72;
        auVar127._24_4_ = fVar72;
        auVar127._28_4_ = fVar72;
        *(undefined4 *)(local_3e0 + (uint)(iVar10 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar68) = local_3e0;
        uVar69 = uVar65 - 1;
        if ((((((((local_3e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_3e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_3e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_3e0 >> 0x7f,0) != '\0') ||
              (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_3e0 >> 0xbf,0) != '\0') ||
            (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_3e0[0x1f] < '\0') {
          uVar69 = uVar65;
        }
        fVar104 = fVar104 - fVar72;
        auVar148._4_4_ = fVar104;
        auVar148._0_4_ = fVar104;
        auVar148._8_4_ = fVar104;
        auVar148._12_4_ = fVar104;
        auVar148._16_4_ = fVar104;
        auVar148._20_4_ = fVar104;
        auVar148._24_4_ = fVar104;
        auVar148._28_4_ = fVar104;
        auVar83 = vfmadd132ps_fma(auVar148,auVar127,_DAT_02020f20);
        _local_420 = ZEXT1632(auVar83);
        local_7a0._8_8_ = 0;
        local_7a0._0_8_ = *(ulong *)(local_420 + (uint)(iVar10 << 2));
        uVar66 = (ulong)uVar69;
      }
      fVar104 = (float)local_860._0_4_;
      fVar72 = (float)local_860._4_4_;
      fVar136 = fStack_858;
      fVar224 = fStack_854;
      fVar141 = fStack_850;
      fVar137 = fStack_84c;
      fVar225 = fStack_848;
      fVar138 = fStack_844;
    } while (((((((bVar52 && bVar53) && bVar51) && bVar50) && bVar49) && bVar48) && bVar45) &&
             bVar30);
    auVar248 = auVar249._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }